

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void reg_alloc(gen_ctx_t gen_ctx)

{
  bitmap_t *ppVVar1;
  uint32_t *puVar2;
  size_t *psVar3;
  undefined1 auVar4 [32];
  int iVar5;
  VARR_int *pVVar6;
  bitmap_el_t *pbVar7;
  live_range_t plVar8;
  VARR_MIR_reg_t *pVVar9;
  long *plVar10;
  lr_bb_t plVar11;
  ulong *puVar12;
  bitmap_t pVVar13;
  MIR_item_t pMVar14;
  VARR_bitmap_t *pVVar15;
  byte bVar16;
  double dVar17;
  gen_ctx **ppgVar18;
  MIR_insn_t tail_insn;
  DLIST_LINK_bb_t *pDVar19;
  uint uVar20;
  live_range_t_conflict *pplVar21;
  bb_t_conflict *__ptr;
  data_flow_ctx *pdVar22;
  VARR_bb_t *pVVar23;
  MIR_insn_t pMVar24;
  VARR_live_range_t *pVVar25;
  int *piVar26;
  spill_cache_el_t *__ptr_00;
  func_cfg_t extraout_RAX;
  func_cfg_t pfVar27;
  bb_t pbVar28;
  loop_node_t_conflict plVar29;
  spill_el_t *psVar30;
  MIR_item_t pMVar31;
  bb_insn_t pbVar32;
  bb_insn_t pbVar33;
  ra_ctx *prVar34;
  anon_union_8_2_0ec0d2a8_for_u *paVar35;
  out_edge_t peVar36;
  in_edge_t_conflict peVar37;
  ra_ctx *prVar38;
  MIR_insn_t_conflict insn;
  bb_t_conflict pbVar39;
  VARR_spill_el_t *pVVar40;
  VARR_spill_el_t *extraout_RAX_00;
  in_edge_t peVar41;
  gen_ctx *pgVar42;
  MIR_item_t_conflict pMVar43;
  undefined8 *puVar44;
  void *pvVar45;
  bb_insn_t_conflict pbVar46;
  gen_ctx *pgVar47;
  lr_ctx *plVar48;
  bb_t pbVar49;
  void *pvVar50;
  MIR_context_t pMVar51;
  MIR_insn_t pMVar52;
  DLIST_LINK_MIR_item_t *pDVar53;
  DLIST_LINK_in_edge_t *pDVar54;
  DLIST_in_edge_t *pDVar55;
  in_edge_t peVar56;
  in_edge_t *ppeVar57;
  FILE *__stream;
  char *pcVar58;
  MIR_op_t *pMVar59;
  bb_t *ppbVar60;
  int iVar61;
  ulong uVar62;
  VARR_spill_cache_el_t *pVVar63;
  void *pvVar64;
  lr_bb_t_conflict plVar65;
  bitmap_t pVVar66;
  gen_ctx_t pgVar67;
  undefined1 *puVar68;
  MIR_context_t pMVar69;
  gen_ctx_t bb_insn;
  uint uVar70;
  MIR_reg_t MVar71;
  ulong uVar72;
  long lVar73;
  MIR_reg_t reg;
  size_t sVar74;
  FILE *pFVar75;
  gen_ctx_t pgVar76;
  ra_ctx *__s1;
  ulong uVar77;
  char *pcVar78;
  ulong uVar79;
  live_range_t_conflict plVar80;
  bb_insn_t pbVar81;
  live_range_t_conflict plVar82;
  ra_ctx *__ptr_01;
  lr_bb_t_conflict plVar83;
  MIR_insn_t pMVar84;
  gen_ctx_t pgVar85;
  gen_ctx_t pgVar86;
  void **ppvVar87;
  long lVar88;
  char *bb;
  size_t sVar89;
  edge_t_conflict peVar90;
  ulong uVar91;
  MIR_reg_t *reg_map;
  bool bVar92;
  double dVar93;
  undefined1 in_ZMM0 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 in_ZMM2 [64];
  int iStack_1b4;
  gen_ctx_t pgStack_1b0;
  uint uStack_1a8;
  undefined1 auStack_1a4 [20];
  size_t sStack_190;
  bb_t_conflict pbStack_188;
  bb_t *ppbStack_180;
  gen_ctx_t pgStack_178;
  gen_ctx_t pgStack_170;
  DLIST_LINK_bb_t *pDStack_168;
  ulong uStack_160;
  gen_ctx_t pgStack_158;
  bb_t_conflict pbStack_150;
  void **ppvStack_148;
  in_edge_t peStack_140;
  edge_t_conflict peStack_138;
  bitmap_t pVStack_130;
  MIR_context_t local_128;
  bb_t pbStack_120;
  ra_ctx *prStack_118;
  bitmap_t pVStack_110;
  bitmap_t pVStack_108;
  bitmap_t pVStack_100;
  gen_ctx_t local_f8;
  MIR_context_t local_f0;
  bb_t local_e8;
  gen_ctx_t local_e0;
  ra_ctx *local_d8;
  ra_ctx *local_d0;
  MIR_context_t local_c8;
  MIR_reg_t local_bc;
  bb_insn_t local_b8;
  DLIST_LINK_in_edge_t *local_b0;
  spill_el_t *local_a8;
  MIR_insn_t_conflict local_a0;
  rewrite_data local_98;
  bitmap_t pVStack_80;
  bitmap_t pVStack_78;
  bitmap_t pVStack_70;
  undefined1 local_68 [16];
  size_t sStack_58;
  VARR_lr_gap_t *pVStack_50;
  bitmap_t pVStack_48;
  bitmap_t pVStack_40;
  
  plVar48 = gen_ctx->lr_ctx;
  uVar70 = gen_ctx->optimize_level;
  local_f0 = (MIR_context_t)(ulong)gen_ctx->curr_cfg->max_var;
  plVar48->curr_point = 0;
  pVVar25 = plVar48->var_live_ranges;
  if (pVVar25 == (VARR_live_range_t *)0x0) {
    pVStack_130 = (bitmap_t)0x15e50b;
    reg_alloc_cold_82();
LAB_0015e50b:
    pVStack_130 = (bitmap_t)0x15e52a;
    __assert_fail("(VARR_live_range_tlength (gen_ctx->lr_ctx->var_live_ranges)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1980,"void build_live_ranges(gen_ctx_t)");
  }
  if (pVVar25->els_num != 0) goto LAB_0015e50b;
  puVar68 = (undefined1 *)((long)&local_f0->gen_ctx + 1);
  local_e0 = (gen_ctx_t)CONCAT44(local_e0._4_4_,uVar70);
  do {
    pVVar25 = gen_ctx->lr_ctx->var_live_ranges;
    pplVar21 = pVVar25->varr;
    if (pplVar21 == (live_range_t_conflict *)0x0) goto LAB_0015e2f3;
    sVar89 = pVVar25->els_num;
    uVar62 = sVar89 + 1;
    if (pVVar25->size < uVar62) {
      sVar89 = (uVar62 >> 1) + uVar62;
      pVStack_130 = (bitmap_t)0x15bcf2;
      pplVar21 = (live_range_t_conflict *)realloc(pplVar21,sVar89 * 8);
      pVVar25->varr = pplVar21;
      pVVar25->size = sVar89;
      sVar89 = pVVar25->els_num;
      uVar62 = sVar89 + 1;
    }
    puVar68 = puVar68 + -1;
    pVVar25->els_num = uVar62;
    pplVar21[sVar89] = (live_range_t_conflict)0x0;
  } while (puVar68 != (undefined1 *)0x0);
  uVar70 = gen_ctx->optimize_level;
  if (uVar70 != 0) {
    pdVar22 = gen_ctx->data_flow_ctx;
    pVVar23 = pdVar22->worklist;
    if ((pVVar23 == (VARR_bb_t *)0x0) || (pVVar23->varr == (bb_t_conflict *)0x0)) {
      pVStack_130 = (bitmap_t)0x15e4e4;
      reg_alloc_cold_5();
LAB_0015e4e4:
      pVStack_130 = (bitmap_t)0x15e506;
      __assert_fail("(DLIST_out_edge_t_length (&(e->src->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->src->in_edges))) == 1"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x20ce,"void transform_edge_to_bb_placement(gen_ctx_t)");
    }
    pVVar23->els_num = 0;
    pbVar39 = (gen_ctx->curr_cfg->bbs).head;
    if (pbVar39 != (bb_t_conflict)0x0) {
      do {
        pVVar23 = gen_ctx->data_flow_ctx->worklist;
        __ptr = pVVar23->varr;
        if (__ptr == (bb_t_conflict *)0x0) {
          pVStack_130 = (bitmap_t)0x15e382;
          reg_alloc_cold_1();
LAB_0015e382:
          pVStack_130 = (bitmap_t)0x15e387;
          reg_alloc_cold_26();
LAB_0015e387:
          pVStack_130 = (bitmap_t)0x15e38c;
          reg_alloc_cold_21();
LAB_0015e38c:
          pVStack_130 = (bitmap_t)0x15e391;
          reg_alloc_cold_20();
LAB_0015e391:
          pVStack_130 = (bitmap_t)0x15e3b0;
          __assert_fail("spill_els_addr[i].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x209a,"void transform_edge_to_bb_placement(gen_ctx_t)");
        }
        sVar89 = pVVar23->els_num;
        uVar62 = sVar89 + 1;
        if (pVVar23->size < uVar62) {
          sVar89 = (uVar62 >> 1) + uVar62;
          pVStack_130 = (bitmap_t)0x15bd8f;
          __ptr = (bb_t_conflict *)realloc(__ptr,sVar89 * 8);
          pVVar23->varr = __ptr;
          pVVar23->size = sVar89;
          sVar89 = pVVar23->els_num;
          uVar62 = sVar89 + 1;
        }
        pVVar23->els_num = uVar62;
        __ptr[sVar89] = pbVar39;
        pbVar39 = (pbVar39->bb_link).next;
      } while (pbVar39 != (bb_t)0x0);
      uVar70 = gen_ctx->optimize_level;
      pdVar22 = gen_ctx->data_flow_ctx;
    }
    if (uVar70 < 2) {
      pVVar23 = pdVar22->worklist;
      if (pVVar23 == (VARR_bb_t *)0x0) {
        pVStack_130 = (bitmap_t)0x15e5da;
        reg_alloc_cold_4();
LAB_0015e5da:
        pVStack_130 = (bitmap_t)0x15e5df;
        reg_alloc_cold_33();
LAB_0015e5df:
        pVStack_130 = (bitmap_t)0x15e601;
        __assert_fail("(DLIST_bb_insn_t_tail (&(e2->src->bb_insns))) != ((void*)0) && MIR_any_branch_code_p ((DLIST_bb_insn_t_tail (&(e2->src->bb_insns)))->insn->code)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x3bd,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
      }
      pVStack_130 = (bitmap_t)0x15bde2;
      qsort(pVVar23->varr,pVVar23->els_num,8,post_cmp);
      pdVar22 = gen_ctx->data_flow_ctx;
    }
    pVVar23 = pdVar22->worklist;
    if (pVVar23 != (VARR_bb_t *)0x0) {
      uVar62 = 0;
      do {
        if (pVVar23->els_num <= uVar62) goto LAB_0015becf;
        if (pVVar23->varr == (bb_t_conflict *)0x0) goto LAB_0015e34f;
        pbVar39 = pVVar23->varr[uVar62];
        pbVar81 = (pbVar39->bb_insns).head;
        if (pbVar81 != (bb_insn_t)0x0) {
          pVStack_130 = (bitmap_t)0x15be28;
          process_bb_ranges(gen_ctx,pbVar39,pbVar81->insn,((pbVar39->bb_insns).tail)->insn);
          pVVar23 = gen_ctx->data_flow_ctx->worklist;
        }
        uVar62 = uVar62 + 1;
      } while (pVVar23 != (VARR_bb_t *)0x0);
    }
    pVStack_130 = (bitmap_t)0x15be3f;
    reg_alloc_cold_3();
  }
  pMVar84 = (((gen_ctx->curr_func_item->u).func)->insns).head;
  pMVar52 = pMVar84;
  while (tail_insn = pMVar84, tail_insn != (MIR_insn_t)0x0) {
    pMVar84 = (tail_insn->insn_link).next;
    if (gen_ctx->optimize_level == 0) {
      uVar70 = *(int *)&pMVar52->field_0x18 - 0xa7;
      pMVar24 = pMVar52;
      if ((uVar70 < 0xe) && ((0x2007U >> (uVar70 & 0x1f) & 1) != 0)) {
        pMVar24 = (MIR_insn_t)pMVar52->data;
      }
      pbVar39 = (bb_t_conflict)pMVar24->data;
      if (pMVar84 != (MIR_insn_t)0x0) {
        uVar70 = *(int *)&pMVar84->field_0x18 - 0xa7;
        pMVar24 = pMVar84;
        if ((uVar70 < 0xe) && ((0x2007U >> (uVar70 & 0x1f) & 1) != 0)) {
          pMVar24 = (MIR_insn_t)pMVar84->data;
        }
        goto LAB_0015beb0;
      }
      goto LAB_0015beb5;
    }
    pbVar39 = *(bb_t_conflict *)((long)pMVar52->data + 0x30);
    if (pMVar84 == (MIR_insn_t)0x0) goto LAB_0015beb5;
    pMVar24 = (MIR_insn_t)((long)pMVar84->data + 0x30);
LAB_0015beb0:
    if (pbVar39 != (bb_t_conflict)pMVar24->data) {
LAB_0015beb5:
      pVStack_130 = (bitmap_t)0x15bebd;
      process_bb_ranges(gen_ctx,pbVar39,pMVar52,tail_insn);
      pMVar52 = pMVar84;
    }
  }
LAB_0015becf:
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    pVStack_130 = (bitmap_t)0x15bee5;
    print_all_live_ranges(gen_ctx);
  }
  plVar48 = gen_ctx->lr_ctx;
  pVVar66 = plVar48->points_with_born_vars;
  if ((pVVar66 == (bitmap_t)0x0) || (pVVar66->varr == (bitmap_el_t *)0x0)) {
LAB_0015e4b1:
    pVStack_130 = (bitmap_t)0x15e4b6;
    reg_alloc_cold_80();
  }
  else {
    pVVar66->els_num = 0;
    pVVar66 = plVar48->points_with_dead_vars;
    if ((pVVar66 != (bitmap_t)0x0) && (pVVar66->varr != (bitmap_el_t *)0x0)) {
      pVVar66->els_num = 0;
      pVVar25 = plVar48->var_live_ranges;
      if (pVVar25 != (VARR_live_range_t *)0x0) {
        uVar62 = 0;
        do {
          if (pVVar25->els_num <= uVar62) goto LAB_0015c009;
          if (pVVar25->varr == (live_range_t_conflict *)0x0) goto LAB_0015e2f8;
          plVar80 = pVVar25->varr[uVar62];
          if (plVar80 != (live_range_t_conflict)0x0) {
            do {
              uVar72 = (ulong)plVar80->start;
              if (plVar80->finish < plVar80->start) {
                pVStack_130 = (bitmap_t)0x15e2a2;
                __assert_fail("lr->start <= lr->finish",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x18db,"void shrink_live_ranges(gen_ctx_t)");
              }
              pVVar66 = gen_ctx->lr_ctx->points_with_born_vars;
              pVStack_130 = (bitmap_t)0x15bf89;
              bitmap_expand(pVVar66,uVar72 + 1);
              if (pVVar66 == (bitmap_t)0x0) {
                pVStack_130 = (bitmap_t)0x15e2a7;
                reg_alloc_cold_76();
LAB_0015e2a7:
                pVStack_130 = (bitmap_t)0x15e2ac;
                reg_alloc_cold_75();
                goto LAB_0015e2ac;
              }
              pVVar66->varr[uVar72 >> 6] = pVVar66->varr[uVar72 >> 6] | 1L << (uVar72 & 0x3f);
              uVar72 = (ulong)plVar80->finish;
              pVVar66 = gen_ctx->lr_ctx->points_with_dead_vars;
              pVStack_130 = (bitmap_t)0x15bfc2;
              bitmap_expand(pVVar66,uVar72 + 1);
              if (pVVar66 == (bitmap_t)0x0) goto LAB_0015e2a7;
              pVVar66->varr[uVar72 >> 6] = pVVar66->varr[uVar72 >> 6] | 1L << (uVar72 & 0x3f);
              plVar80 = plVar80->next;
            } while (plVar80 != (live_range_t)0x0);
            plVar48 = gen_ctx->lr_ctx;
          }
          pVVar25 = plVar48->var_live_ranges;
          uVar62 = uVar62 + 1;
        } while (pVVar25 != (VARR_live_range_t *)0x0);
      }
      pVStack_130 = (bitmap_t)0x15c009;
      reg_alloc_cold_78();
LAB_0015c009:
      pVVar6 = plVar48->point_map;
      if ((pVVar6 != (VARR_int *)0x0) && (pVVar6->varr != (int *)0x0)) {
        pVVar6->els_num = 0;
        if (-1 < plVar48->curr_point) {
          iVar61 = -1;
          do {
            pVVar6 = plVar48->point_map;
            piVar26 = pVVar6->varr;
            if (piVar26 == (int *)0x0) {
LAB_0015e345:
              pVStack_130 = (bitmap_t)0x15e34a;
              reg_alloc_cold_6();
LAB_0015e34a:
              pVStack_130 = (bitmap_t)0x15e34f;
              reg_alloc_cold_22();
LAB_0015e34f:
              pVStack_130 = (bitmap_t)0x15e354;
              reg_alloc_cold_2();
LAB_0015e354:
              pVStack_130 = (bitmap_t)0x15e359;
              reg_alloc_cold_57();
LAB_0015e359:
              pVStack_130 = (bitmap_t)0x15e35e;
              reg_alloc_cold_18();
LAB_0015e35e:
              pVStack_130 = (bitmap_t)0x15e37d;
              __assert_fail("reg > ST1_HARD_REG",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x210e,"void split(gen_ctx_t)");
            }
            sVar89 = pVVar6->els_num;
            uVar62 = sVar89 + 1;
            if (pVVar6->size < uVar62) {
              sVar89 = (uVar62 >> 1) + uVar62;
              pVStack_130 = (bitmap_t)0x15c06a;
              piVar26 = (int *)realloc(piVar26,sVar89 * 4);
              pVVar6->varr = piVar26;
              pVVar6->size = sVar89;
              sVar89 = pVVar6->els_num;
              plVar48 = gen_ctx->lr_ctx;
              uVar62 = sVar89 + 1;
            }
            pVVar6->els_num = uVar62;
            piVar26[sVar89] = 0;
            iVar61 = iVar61 + 1;
          } while (iVar61 < plVar48->curr_point);
        }
        pVStack_130 = (bitmap_t)0x15c0a2;
        bitmap_ior(plVar48->points_with_born_or_dead_vars,plVar48->points_with_born_vars,
                   plVar48->points_with_dead_vars);
        pMVar69 = local_f0;
        plVar48 = gen_ctx->lr_ctx;
        pVVar66 = plVar48->points_with_born_or_dead_vars;
        if (pVVar66 == (bitmap_t)0x0) {
          pVStack_130 = (bitmap_t)0x15e52f;
          reg_alloc_cold_73();
        }
        else {
          uVar62 = pVVar66->els_num;
          if (uVar62 == 0) {
            lVar88 = -1;
          }
          else {
            pbVar7 = pVVar66->varr;
            lVar88 = -1;
            uVar79 = 0;
            uVar72 = 0;
            uVar70 = 1;
LAB_0015c0db:
            do {
              if ((pbVar7[uVar79] != 0) && (uVar77 = pbVar7[uVar79] >> (uVar72 & 0x3f), uVar77 != 0)
                 ) {
                uVar79 = uVar77 & 1;
                while (uVar79 == 0) {
                  uVar72 = uVar72 + 1;
                  uVar79 = uVar77 & 2;
                  uVar77 = uVar77 >> 1;
                }
                pVVar66 = plVar48->points_with_born_vars;
                if (pVVar66 == (bitmap_t)0x0) {
                  pVStack_130 = (bitmap_t)0x15e5b1;
                  reg_alloc_cold_10();
                }
                else {
                  if (uVar72 < pVVar66->els_num << 6) {
                    bVar92 = (pVVar66->varr[uVar72 >> 6] >> (uVar72 & 0x3f) & 1) != 0;
                  }
                  else {
                    bVar92 = false;
                  }
                  pVVar66 = plVar48->points_with_dead_vars;
                  if (pVVar66 != (bitmap_t)0x0) {
                    uVar20 = 0;
                    if (uVar72 < pVVar66->els_num << 6) {
                      uVar20 = (uint)(pVVar66->varr[uVar72 >> 6] >> (uVar72 & 0x3f)) & 1;
                    }
                    if (uVar20 == 0 && !bVar92) goto LAB_0015e58d;
                    pVVar6 = plVar48->point_map;
                    if ((bool)(uVar70 != 0 & bVar92)) {
                      if (((pVVar6 == (VARR_int *)0x0) ||
                          (piVar26 = pVVar6->varr, piVar26 == (int *)0x0)) ||
                         (pVVar6->els_num <= uVar72)) goto LAB_0015e55c;
                      lVar88 = lVar88 + 1;
                    }
                    else if (((pVVar6 == (VARR_int *)0x0) ||
                             (piVar26 = pVVar6->varr, piVar26 == (int *)0x0)) ||
                            (pVVar6->els_num <= uVar72)) goto LAB_0015e557;
                    piVar26[uVar72] = (int)lVar88;
                    uVar72 = uVar72 + 1;
                    uVar79 = uVar72 >> 6;
                    uVar70 = uVar20;
                    if (uVar62 <= uVar79) break;
                    goto LAB_0015c0db;
                  }
                }
                pVStack_130 = (bitmap_t)0x15e5b6;
                reg_alloc_cold_9();
LAB_0015e5b6:
                pVStack_130 = (bitmap_t)0x15e5d5;
                __assert_fail("i < last_insn->nops",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x3ff,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
              }
              uVar79 = uVar79 + 1;
              uVar72 = uVar79 * 0x40;
            } while (uVar62 != uVar79);
          }
          pVVar25 = plVar48->var_live_ranges;
          if (pVVar25 != (VARR_live_range_t *)0x0) {
            sVar89 = pVVar25->els_num;
            local_f8 = gen_ctx;
            if (sVar89 == 0) {
              pgVar76 = (gen_ctx_t)0x0;
              pgVar86 = (gen_ctx_t)0x0;
LAB_0015c31c:
              bb = (char *)(lVar88 + 1);
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                pVStack_130 = (bitmap_t)0x15df79;
                fprintf((FILE *)gen_ctx->debug_file,
                        "Compressing live range points: from %d to %ld - %ld%%\n",
                        (ulong)(uint)plVar48->curr_point,bb);
                __stream = (FILE *)gen_ctx->debug_file;
                if (pgVar76 == pgVar86) goto LAB_0015e241;
                goto LAB_0015e226;
              }
              plVar48->curr_point = (int)bb;
LAB_0015c35b:
              pVStack_130 = (bitmap_t)0x15c363;
              assign(gen_ctx);
              if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                pVStack_130 = (bitmap_t)0x15c391;
                fwrite("+++++++++++++Disposition after assignment:",0x2a,1,
                       (FILE *)gen_ctx->debug_file);
                if (0x21 < (uint)pMVar69) {
                  uVar62 = 0x22;
                  do {
                    if ((uVar62 & 7) == 0) {
                      pVStack_130 = (bitmap_t)0x15c3c8;
                      fputc(10,(FILE *)gen_ctx->debug_file);
                    }
                    pVStack_130 = (bitmap_t)0x15c3d8;
                    fprintf((FILE *)gen_ctx->debug_file," %3u=>",uVar62);
                    pVVar25 = gen_ctx->lr_ctx->var_live_ranges;
                    if (pVVar25 == (VARR_live_range_t *)0x0) {
                      pVStack_130 = (bitmap_t)0x15e411;
                      reg_alloc_cold_16();
                      goto LAB_0015e411;
                    }
                    if (uVar62 < pVVar25->els_num) {
                      if (pVVar25->varr == (live_range_t_conflict *)0x0) goto LAB_0015e4ac;
                      if (pVVar25->varr[uVar62] == (live_range_t_conflict)0x0) goto LAB_0015c444;
                      pVVar9 = gen_ctx->ra_ctx->reg_renumber;
                      if (((pVVar9 == (VARR_MIR_reg_t *)0x0) || (pVVar9->varr == (MIR_reg_t *)0x0))
                         || (pVVar9->els_num <= uVar62)) {
                        pVStack_130 = (bitmap_t)0x15e454;
                        reg_alloc_cold_14();
LAB_0015e454:
                        pVStack_130 = (bitmap_t)0x15e459;
                        reg_alloc_cold_19();
LAB_0015e459:
                        pVStack_130 = (bitmap_t)0x15e478;
                        __assert_fail("nel > ST1_HARD_REG",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x2019,"void rewrite(gen_ctx_t)");
                      }
                      pVStack_130 = (bitmap_t)0x15c442;
                      fprintf((FILE *)gen_ctx->debug_file,"%-2u",(ulong)pVVar9->varr[uVar62]);
                    }
                    else {
LAB_0015c444:
                      pVStack_130 = (bitmap_t)0x15c45a;
                      fwrite("UA",2,1,(FILE *)gen_ctx->debug_file);
                    }
                    uVar70 = (int)uVar62 + 1;
                    uVar62 = (ulong)uVar70;
                  } while (uVar70 <= (uint)pMVar69);
                }
                pVStack_130 = (bitmap_t)0x15c472;
                fputc(10,(FILE *)gen_ctx->debug_file);
              }
              MVar71 = 5 - (gen_ctx->target_ctx->keep_fp_p == '\0');
              pVStack_130 = (bitmap_t)0x15c496;
              local_d8 = (ra_ctx *)
                         _MIR_get_module_global_var_hard_regs
                                   (gen_ctx->ctx,gen_ctx->curr_func_item->module);
              if (gen_ctx->optimize_level < 2) {
                pMVar84 = (((gen_ctx->curr_func_item->u).func)->insns).head;
                if (pMVar84 == (MIR_insn_t)0x0) {
LAB_0015c7d8:
                  lVar88 = 0;
                  bb = (char *)0x0;
                  pgVar76 = (gen_ctx_t)0x0;
                }
                else {
                  pgVar76 = (gen_ctx_t)0x0;
                  bb = (char *)0x0;
                  lVar88 = 0;
                  do {
                    pMVar52 = (pMVar84->insn_link).next;
                    bb = (char *)((long)((gen_ctx_t)bb)->call_used_hard_regs +
                                 ((ulong)((*(ulong *)&pMVar84->field_0x18 & 0xfffffffc) == 0) - 0x68
                                 ));
                    pVStack_130 = (bitmap_t)0x15c4e1;
                    uVar70 = rewrite_insn(local_f8,pMVar84,MVar71,(rewrite_data *)0x0);
                    lVar88 = lVar88 + (ulong)uVar70;
                    pgVar76 = (gen_ctx_t)((long)&pgVar76->ctx + 1);
                    pMVar84 = pMVar52;
                  } while (pMVar52 != (MIR_insn_t)0x0);
                }
              }
              else {
                prVar38 = gen_ctx->ra_ctx;
                local_e8 = (bb_t)gen_ctx->temp_bitmap;
                local_d0 = (ra_ctx *)gen_ctx->temp_bitmap2;
                puVar2 = &prVar38->spill_cache_age;
                *puVar2 = *puVar2 + 1;
                pVVar63 = prVar38->spill_cache;
                if ((pVVar63 == (VARR_spill_cache_el_t *)0x0) ||
                   (pVVar63->varr == (spill_cache_el_t *)0x0)) goto LAB_0015e534;
                pVVar63->els_num = 0;
                do {
                  pfVar27 = gen_ctx->curr_cfg;
                  uVar62 = pVVar63->els_num;
                  if (pfVar27->max_var < uVar62) goto LAB_0015c5aa;
                  __ptr_00 = pVVar63->varr;
                  if (__ptr_00 == (spill_cache_el_t *)0x0) goto LAB_0015e359;
                  uVar72 = uVar62 + 1;
                  if (pVVar63->size <= uVar62) {
                    sVar89 = (uVar72 >> 1) + uVar72;
                    pVStack_130 = (bitmap_t)0x15c578;
                    __ptr_00 = (spill_cache_el_t *)realloc(__ptr_00,sVar89 * 8);
                    pVVar63->varr = __ptr_00;
                    pVVar63->size = sVar89;
                    uVar62 = pVVar63->els_num;
                    uVar72 = uVar62 + 1;
                  }
                  pVVar63->els_num = uVar72;
                  __ptr_00[uVar62].age = 0;
                  __ptr_00[uVar62].slot = 0;
                  pVVar63 = gen_ctx->ra_ctx->spill_cache;
                } while (pVVar63 != (VARR_spill_cache_el_t *)0x0);
                pVStack_130 = (bitmap_t)0x15c5aa;
                reg_alloc_cold_17();
                pfVar27 = extraout_RAX;
LAB_0015c5aa:
                pMVar69 = (MIR_context_t)(pfVar27->bbs).head;
                if (pMVar69 == (MIR_context_t)0x0) goto LAB_0015c7d8;
                pgVar76 = (gen_ctx_t)0x0;
                bb = (char *)0x0;
                lVar88 = 0;
                pbVar49 = local_e8;
                local_bc = MVar71;
                do {
                  prVar38 = local_d0;
                  local_98.regs_to_save = (bitmap_t)local_d0;
                  pVStack_130 = (bitmap_t)0x15c5f7;
                  local_f0 = pMVar69;
                  local_98.bb = (bb_t_conflict)pMVar69;
                  local_98.live = (bitmap_t)pbVar49;
                  bitmap_copy((bitmap_t)pbVar49,
                              (const_bitmap_t)(pMVar69->environment_module).module_link.prev);
                  MVar71 = local_bc;
                  if ((prVar38 == (ra_ctx *)0x0) ||
                     ((MIR_insn_t)prVar38->sorted_regs == (MIR_insn_t)0x0)) goto LAB_0015e34a;
                  *(void **)&prVar38->start_mem_loc = (void *)0x0;
                  pcVar58 = (local_f0->environment_module).name;
                  while (pcVar58 != (char *)0x0) {
                    pMVar84 = *(MIR_insn_t *)pcVar58;
                    pcVar58 = *(char **)(pcVar58 + 0x20);
                    bb = (char *)((long)((gen_ctx_t)bb)->call_used_hard_regs +
                                 ((ulong)((*(ulong *)&pMVar84->field_0x18 & 0xfffffffc) == 0) - 0x68
                                 ));
                    pVStack_130 = (bitmap_t)0x15c653;
                    uVar70 = rewrite_insn(local_f8,pMVar84,MVar71,&local_98);
                    lVar88 = lVar88 + (ulong)uVar70;
                    pgVar76 = (gen_ctx_t)((long)&pgVar76->ctx + 1);
                  }
                  if (local_e8 == (bb_t)0x0) goto LAB_0015e387;
                  pbVar49 = (bb_t)(local_f0->environment_module).items.tail;
                  if (pbVar49 == (bb_t)0x0) goto LAB_0015e38c;
                  pvVar45 = (void *)local_e8->index;
                  pvVar50 = (void *)pbVar49->index;
                  pbVar28 = local_e8;
                  pvVar64 = pvVar45;
                  if (pvVar50 < pvVar45) {
                    pbVar28 = pbVar49;
                    pbVar49 = local_e8;
                    pvVar64 = pvVar50;
                    pvVar50 = pvVar45;
                  }
                  pMVar31 = ((DLIST_LINK_MIR_item_t *)&pbVar49->rpost)->prev;
                  pVStack_130 = (bitmap_t)0x15c6b7;
                  iVar61 = bcmp(((DLIST_LINK_MIR_item_t *)&pbVar28->rpost)->prev,pMVar31,
                                (long)pvVar64 * 8);
                  MVar71 = local_bc;
                  pbVar49 = local_e8;
                  if (iVar61 != 0) goto LAB_0015e2bb;
                  if (pvVar64 < pvVar50) {
                    do {
                      if ((&pMVar31->data)[(long)pvVar64] != (void *)0x0) goto LAB_0015e2bb;
                      pvVar64 = (void *)((long)pvVar64 + 1);
                    } while (pvVar50 != pvVar64);
                  }
                  pvVar45 = *(void **)&local_d0->start_mem_loc;
                  if (pvVar45 != (void *)0x0) {
                    pvVar50 = (void *)0x0;
                    uVar62 = 0;
                    do {
                      while ((uVar72 = *(ulong *)((long)((MIR_insn_t)local_d0->sorted_regs)->ops +
                                                 (long)pvVar50 * 8 + -0x20), uVar72 == 0 ||
                             (uVar72 = uVar72 >> (uVar62 & 0x3f), uVar72 == 0))) {
                        pvVar50 = (void *)((long)pvVar50 + 1);
                        uVar62 = (long)pvVar50 * 0x40;
                        if (pvVar45 == pvVar50) goto LAB_0015c7c4;
                      }
                      uVar79 = uVar72 & 1;
                      while (uVar79 == 0) {
                        uVar62 = uVar62 + 1;
                        uVar79 = uVar72 & 2;
                        uVar72 = uVar72 >> 1;
                      }
                      if (uVar62 < 0x22) goto LAB_0015e459;
                      plVar10 = *(long **)&(local_f0->environment_module).last_temp_item_num;
                      if (plVar10 == (long *)0x0) goto LAB_0015e454;
                      reg = (MIR_reg_t)uVar62;
                      if (((ulong)(*plVar10 << 6) <= (uVar62 & 0xffffffff)) ||
                         ((*(ulong *)(plVar10[2] + (uVar62 >> 6 & 0x3ffffff) * 8) >> (uVar62 & 0x3f)
                          & 1) == 0)) goto LAB_0015e3bf;
                      uVar62 = uVar62 + 1;
                      pMVar84 = *(local_f0->environment_module).data;
                      pVStack_130 = (bitmap_t)0x15c7a6;
                      spill_restore_reg(local_f8,reg,MVar71,pMVar84,
                                        (uint)(*(int *)&pMVar84->field_0x18 == 0xb4),0);
                      pvVar50 = (void *)(uVar62 >> 6);
                      pvVar45 = *(void **)&local_d0->start_mem_loc;
                    } while (pvVar50 < pvVar45);
                  }
LAB_0015c7c4:
                  pMVar69 = (MIR_context_t)local_f0->unspec_protos;
                } while (pMVar69 != (MIR_context_t)0x0);
              }
              if (((FILE *)local_f8->debug_file != (FILE *)0x0) &&
                 (0 < *(int *)&((DLIST_LINK_bb_t *)&local_f8->debug_level)->prev)) {
                auVar95 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,lVar88);
                dVar17 = auVar95._0_8_ * 100.0;
                auVar95 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,bb);
                dVar93 = dVar17 / auVar95._0_8_;
                in_ZMM0 = ZEXT864((ulong)dVar93);
                auVar95 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,pgVar76);
                in_ZMM2 = ZEXT1664(auVar95);
                pVStack_130 = (bitmap_t)0x15c833;
                fprintf((FILE *)local_f8->debug_file,
                        "%5lu deleted RA noop moves out of %lu all moves (%.1f%%), out of %lu all insns (%.1f%%)\n"
                        ,dVar93,dVar17 / auVar95._0_8_,lVar88,bb);
              }
              gen_ctx = local_f8;
              if (local_d8 != (ra_ctx *)0x0) {
                pVStack_130 = (bitmap_t)0x15c851;
                bitmap_and_compl(local_f8->func_used_hard_regs,local_f8->func_used_hard_regs,
                                 (bitmap_t)local_d8);
              }
              if (1 < (uint)local_e0) {
                if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
                  pVStack_130 = (bitmap_t)0x15c91e;
                  fwrite("+++++++++++++Spill info:\n",0x19,1,(FILE *)gen_ctx->debug_file);
                  pVStack_130 = (bitmap_t)0x15c939;
                  print_CFG(gen_ctx,1,0,0,0,output_bb_spill_info);
                }
                local_bc = 5 - (gen_ctx->target_ctx->keep_fp_p == '\0');
                pVVar40 = gen_ctx->ra_ctx->spill_els;
                if ((pVVar40 != (VARR_spill_el_t *)0x0) &&
                   (psVar30 = pVVar40->varr, psVar30 != (spill_el_t *)0x0)) {
                  pVVar40->els_num = 0;
                  pbVar39 = (gen_ctx->curr_cfg->bbs).head;
                  if (pbVar39 != (bb_t_conflict)0x0) {
                    iVar61 = -1;
                    do {
                      pbVar39 = (pbVar39->bb_link).next;
                      if (pbVar39 == (bb_t)0x0) break;
                      bVar92 = iVar61 != 0;
                      iVar61 = iVar61 + 1;
                    } while (bVar92);
                    if (pbVar39 != (bb_t)0x0) {
LAB_0015c9af:
                      if ((pbVar39->bb_insns).head != (bb_insn_t)0x0) {
                        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
                           (1 < *(int *)&((DLIST_LINK_bb_t *)&gen_ctx->debug_level)->prev)) {
                          plVar29 = pbVar39->loop_node;
                          iVar61 = -2;
                          do {
                            plVar29 = plVar29->parent;
                            iVar61 = iVar61 + 1;
                          } while (plVar29 != (loop_node_t)0x0);
                          if (iVar61 < 0) goto LAB_0015e4c0;
                          pVStack_130 = (bitmap_t)0x15c9fb;
                          fprintf((FILE *)gen_ctx->debug_file,
                                  " Process BB%lu(level %d) for splitting\n",(void *)pbVar39->index)
                          ;
                        }
                        peVar90 = (edge_t_conflict)
                                  ((anon_union_8_10_166bea1d_for_u *)&pbVar39->out_edges)[1].func;
                        local_f0 = (MIR_context_t)
                                   ((ulong)local_f0 & 0xff0000ffffffffff | 0x1010000000000);
LAB_0015ca23:
                        if (peVar90 != (edge_t_conflict)0x0) {
                          pVStack_130 = (bitmap_t)0x15ca41;
                          bitmap_and_compl((bitmap_t)
                                           ((DLIST_bb_insn_t *)&gen_ctx->temp_bitmap)->head,
                                           peVar90->dst->gen,pbVar39->gen);
                          pgVar76 = (gen_ctx_t)((DLIST_bb_insn_t *)&gen_ctx->temp_bitmap)->head;
                          if (pgVar76 != (gen_ctx_t)0x0) {
                            pMVar69 = pgVar76->ctx;
                            if (pMVar69 != (MIR_context_t)0x0) {
                              pMVar51 = (MIR_context_t)0x0;
                              do {
                                if ((&pgVar76->curr_func_item->data)[(long)pMVar51] != (void *)0x0)
                                {
                                  pMVar51 = (MIR_context_t)0x0;
                                  uVar62 = 0;
                                  goto LAB_0015ca77;
                                }
                                pMVar51 = (MIR_context_t)((long)&pMVar51->gen_ctx + 1);
                              } while (pMVar69 != pMVar51);
                            }
                            goto LAB_0015ca6d;
                          }
                          pVStack_130 = (bitmap_t)0x15e2df;
                          reg_alloc_cold_25();
                          goto LAB_0015e2df;
                        }
                        pMVar43 = (MIR_item_t_conflict)(pbVar39->in_edges).tail;
                        local_e8 = pbVar39;
LAB_0015cb71:
                        if (pMVar43 == (MIR_item_t_conflict)0x0) goto LAB_0015cdd3;
                        pbVar81 = ((DLIST_bb_insn_t *)&gen_ctx->temp_bitmap)->head;
                        if ((pbVar81 == (bb_insn_t)0x0) || (*(long *)&pbVar81->mem_index == 0))
                        goto LAB_0015e2b6;
                        pbVar81->insn = (MIR_insn_t)0x0;
                        puVar12 = *(ulong **)((long)pMVar43->data + 0x78);
                        if (puVar12 == (ulong *)0x0) {
LAB_0015e2df:
                          pVStack_130 = (bitmap_t)0x15e2e4;
                          reg_alloc_cold_31();
                        }
                        else {
                          uVar62 = *puVar12;
                          if (uVar62 != 0) {
                            uVar79 = 0;
                            uVar72 = 0;
                            do {
                              while ((uVar77 = *(ulong *)(puVar12[2] + uVar79 * 8), uVar77 == 0 ||
                                     (uVar77 = uVar77 >> (uVar72 & 0x3f), uVar77 == 0))) {
                                uVar79 = uVar79 + 1;
                                uVar72 = uVar79 * 0x40;
                                if (uVar62 == uVar79) goto LAB_0015ccae;
                              }
                              uVar79 = uVar77 & 1;
                              uVar91 = uVar72;
                              while (uVar79 == 0) {
                                uVar91 = uVar91 + 1;
                                uVar79 = uVar77 & 2;
                                uVar77 = uVar77 >> 1;
                              }
                              pVVar66 = local_e8->gen;
                              if (pVVar66 == (bitmap_t)0x0) goto LAB_0015e2e9;
                              uVar72 = uVar91 + 1;
                              if ((pVVar66->els_num << 6 <= uVar91) ||
                                 ((pVVar66->varr[uVar91 >> 6] >> (uVar91 & 0x3f) & 1) == 0)) {
                                pVVar66 = local_e8->in;
                                if (pVVar66 == (bitmap_t)0x0) goto LAB_0015e2ee;
                                if ((uVar91 < pVVar66->els_num << 6) &&
                                   (bb = (char *)(uVar91 >> 6),
                                   (pVVar66->varr[(long)bb] >> (uVar91 & 0x3f) & 1) != 0)) {
                                  pgVar76 = (gen_ctx_t)
                                            ((DLIST_bb_insn_t *)&local_f8->temp_bitmap)->head;
                                  pVStack_130 = (bitmap_t)0x15cc7f;
                                  bitmap_expand((bitmap_t)pgVar76,uVar72);
                                  if (pgVar76 == (gen_ctx_t)0x0) goto LAB_0015e382;
                                  ppvVar87 = &pgVar76->curr_func_item->data + (long)bb;
                                  *ppvVar87 = (void *)((ulong)*ppvVar87 | 1L << (uVar91 & 0x3f));
                                  uVar62 = *puVar12;
                                }
                              }
                              uVar79 = uVar72 >> 6;
                            } while (uVar79 < uVar62);
                          }
LAB_0015ccae:
                          gen_ctx = local_f8;
                          pbVar81 = ((DLIST_bb_insn_t *)&local_f8->temp_bitmap)->head;
                          if (pbVar81 != (bb_insn_t)0x0) {
                            pMVar84 = pbVar81->insn;
                            if (pMVar84 != (MIR_insn_t)0x0) {
                              pMVar52 = (MIR_insn_t)0x0;
                              do {
                                if (*(long *)(*(long *)&pbVar81->mem_index + (long)pMVar52 * 8) != 0
                                   ) {
                                  pMVar52 = (MIR_insn_t)0x0;
                                  uVar62 = 0;
                                  goto LAB_0015ccea;
                                }
                                pMVar52 = (MIR_insn_t)((long)&pMVar52->data + 1);
                              } while (pMVar84 != pMVar52);
                            }
                            goto LAB_0015ccdd;
                          }
                        }
                        pVStack_130 = (bitmap_t)0x15e2e9;
                        reg_alloc_cold_30();
LAB_0015e2e9:
                        pVStack_130 = (bitmap_t)0x15e2ee;
                        reg_alloc_cold_28();
LAB_0015e2ee:
                        pVStack_130 = (bitmap_t)0x15e2f3;
                        reg_alloc_cold_27();
                        goto LAB_0015e2f3;
                      }
                      goto LAB_0015e3ed;
                    }
                    goto LAB_0015cdf3;
                  }
                  sVar89 = 0;
                  goto LAB_0015ce07;
                }
                goto LAB_0015e539;
              }
LAB_0015c85c:
              plVar48 = gen_ctx->lr_ctx;
              pVVar25 = plVar48->var_live_ranges;
              if (pVVar25 == (VARR_live_range_t *)0x0) goto LAB_0015e53e;
              sVar89 = pVVar25->els_num;
              pplVar21 = pVVar25->varr;
              if (sVar89 == 0) goto LAB_0015c8d6;
              if (pplVar21 != (live_range_t_conflict *)0x0) {
                sVar74 = 0;
                do {
                  if (pplVar21[sVar74] != (live_range_t_conflict)0x0) {
                    plVar8 = pplVar21[sVar74];
                    plVar80 = plVar48->free_lr_list;
                    do {
                      plVar82 = plVar8;
                      plVar8 = plVar82->next;
                      if (plVar82->lr_bb != (lr_bb_t_conflict)0x0) {
                        plVar65 = plVar48->free_lr_bb_list;
                        plVar11 = plVar82->lr_bb;
                        do {
                          plVar83 = plVar11;
                          plVar11 = plVar83->next;
                          plVar83->next = plVar65;
                          plVar65 = plVar83;
                        } while (plVar11 != (lr_bb_t)0x0);
                        plVar48->free_lr_bb_list = plVar83;
                      }
                      plVar82->next = plVar80;
                      plVar80 = plVar82;
                    } while (plVar8 != (live_range_t)0x0);
                    plVar48->free_lr_list = plVar82;
                  }
                  sVar74 = sVar74 + 1;
                } while (sVar74 != sVar89);
LAB_0015c8d6:
                if (pplVar21 != (live_range_t_conflict *)0x0) {
                  pVVar25->els_num = 0;
                  return;
                }
                goto LAB_0015e543;
              }
              goto LAB_0015e552;
            }
            pplVar21 = pVVar25->varr;
            if (pplVar21 != (live_range_t_conflict *)0x0) {
              pgVar86 = (gen_ctx_t)0x0;
              pgVar76 = (gen_ctx_t)0x0;
              sVar74 = 0;
              do {
                plVar80 = pplVar21[sVar74];
                if (plVar80 != (live_range_t_conflict)0x0) {
                  pVVar6 = plVar48->point_map;
                  if ((pVVar6 == (VARR_int *)0x0) || (piVar26 = pVVar6->varr, piVar26 == (int *)0x0)
                     ) {
LAB_0015e2ac:
                    pVStack_130 = (bitmap_t)0x15e2b1;
                    reg_alloc_cold_12();
LAB_0015e2b1:
                    pVStack_130 = (bitmap_t)0x15e2b6;
                    reg_alloc_cold_11();
LAB_0015e2b6:
                    pVStack_130 = (bitmap_t)0x15e2bb;
                    reg_alloc_cold_32();
LAB_0015e2bb:
                    pVStack_130 = (bitmap_t)0x15e2da;
                    __assert_fail("bitmap_equal_p (live, bb->in)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0x2017,"void rewrite(gen_ctx_t)");
                  }
                  uVar62 = pVVar6->els_num;
                  plVar82 = (live_range_t_conflict)0x0;
                  do {
                    if (uVar62 <= (ulong)(long)plVar80->start) goto LAB_0015e2ac;
                    iVar61 = piVar26[plVar80->start];
                    plVar8 = plVar80->next;
                    plVar80->start = iVar61;
                    if (uVar62 <= (ulong)(long)plVar80->finish) goto LAB_0015e2b1;
                    iVar5 = piVar26[plVar80->finish];
                    plVar80->finish = iVar5;
                    if ((plVar82 == (live_range_t_conflict)0x0) ||
                       ((plVar82->start != iVar5 && (plVar82->start != iVar5 + 1)))) {
LAB_0015c2a4:
                      pgVar76 = (gen_ctx_t)((long)&pgVar76->ctx + 1);
                      plVar82 = plVar80;
                    }
                    else {
                      plVar65 = plVar80->lr_bb;
                      if (plVar82->lr_bb == (lr_bb_t_conflict)0x0) {
                        if (plVar65 != (lr_bb_t_conflict)0x0) goto LAB_0015c2a4;
                        plVar82->start = iVar61;
                        plVar82->next = plVar8;
                      }
                      else {
                        if (plVar65 == (lr_bb_t_conflict)0x0) goto LAB_0015c2a4;
                        plVar82->start = iVar61;
                        plVar82->next = plVar8;
                        do {
                          plVar11 = plVar65->next;
                          plVar65->next = plVar82->lr_bb;
                          plVar82->lr_bb = plVar65;
                          plVar80->lr_bb = plVar11;
                          plVar65 = plVar11;
                        } while (plVar11 != (lr_bb_t)0x0);
                      }
                      plVar80->next = plVar48->free_lr_list;
                      plVar48->free_lr_list = plVar80;
                    }
                    pgVar86 = (gen_ctx_t)((long)&pgVar86->ctx + 1);
                    plVar80 = plVar8;
                  } while (plVar8 != (live_range_t)0x0);
                }
                sVar74 = sVar74 + 1;
              } while (sVar74 != sVar89);
              goto LAB_0015c31c;
            }
            goto LAB_0015e54d;
          }
        }
        pVStack_130 = (bitmap_t)0x15e534;
        reg_alloc_cold_72();
LAB_0015e534:
        pVStack_130 = (bitmap_t)0x15e539;
        reg_alloc_cold_23();
LAB_0015e539:
        pVStack_130 = (bitmap_t)0x15e53e;
        reg_alloc_cold_68();
LAB_0015e53e:
        pVStack_130 = (bitmap_t)0x15e543;
        reg_alloc_cold_71();
LAB_0015e543:
        pVStack_130 = (bitmap_t)0x15e548;
        reg_alloc_cold_70();
LAB_0015e548:
        pVStack_130 = (bitmap_t)0x15e54d;
        reg_alloc_cold_65();
LAB_0015e54d:
        pVStack_130 = (bitmap_t)0x15e552;
        reg_alloc_cold_13();
LAB_0015e552:
        pVStack_130 = (bitmap_t)0x15e557;
        reg_alloc_cold_69();
LAB_0015e557:
        pVStack_130 = (bitmap_t)0x15e55c;
        reg_alloc_cold_7();
LAB_0015e55c:
        pVStack_130 = (bitmap_t)0x15e561;
        reg_alloc_cold_8();
LAB_0015e561:
        pVStack_130 = (bitmap_t)0x15e583;
        __assert_fail("(DLIST_out_edge_t_length (&(e->dst->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->dst->in_edges))) == 1"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x20d2,"void transform_edge_to_bb_placement(gen_ctx_t)");
      }
      goto LAB_0015e4bb;
    }
  }
  pVStack_130 = (bitmap_t)0x15e4bb;
  reg_alloc_cold_79();
LAB_0015e4bb:
  pVStack_130 = (bitmap_t)0x15e4c0;
  reg_alloc_cold_74();
LAB_0015e4c0:
  pVStack_130 = (bitmap_t)0x15e4df;
  __assert_fail("level >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1748,"int bb_loop_level(bb_t)");
  while( true ) {
    sVar89 = pVVar40->els_num;
    uVar72 = sVar89 + 1;
    if (pVVar40->size < uVar72) {
      bb = (char *)((uVar72 >> 1) + uVar72);
      pVStack_130 = (bitmap_t)0x15cb04;
      psVar30 = (spill_el_t *)realloc(psVar30,(long)bb * 0x10);
      pVVar40->varr = psVar30;
      pVVar40->size = (size_t)bb;
      sVar89 = pVVar40->els_num;
      uVar72 = sVar89 + 1;
    }
    uVar79 = uVar62 & 0xffffffff;
    pVVar40->els_num = uVar72;
    uVar62 = uVar62 + 1;
    local_f0 = (MIR_context_t)((ulong)local_f0 & 0xffffff0000000000 | uVar79 | 0x100000000);
    *(MIR_context_t *)(psVar30 + sVar89) = local_f0;
    psVar30[sVar89].u.e = peVar90;
    pMVar51 = (MIR_context_t)(uVar62 >> 6);
    pMVar69 = pgVar76->ctx;
    gen_ctx = local_f8;
    if (pMVar69 <= pMVar51) break;
LAB_0015ca77:
    while ((pvVar45 = (&pgVar76->curr_func_item->data)[(long)pMVar51], pvVar45 == (void *)0x0 ||
           (uVar72 = (ulong)pvVar45 >> (uVar62 & 0x3f), uVar72 == 0))) {
      pMVar51 = (MIR_context_t)((long)&pMVar51->gen_ctx + 1);
      uVar62 = (long)pMVar51 * 0x40;
      if (pMVar69 == pMVar51) goto LAB_0015ca6d;
    }
    uVar79 = uVar72 & 1;
    while (uVar79 == 0) {
      uVar62 = uVar62 + 1;
      uVar79 = uVar72 & 2;
      uVar72 = uVar72 >> 1;
    }
    if (uVar62 < 0x22) goto LAB_0015e2fd;
    pVVar40 = gen_ctx->ra_ctx->spill_els;
    psVar30 = pVVar40->varr;
    if (psVar30 == (spill_el_t *)0x0) {
      pVStack_130 = (bitmap_t)0x15e321;
      reg_alloc_cold_24();
      goto LAB_0015e321;
    }
  }
LAB_0015ca6d:
  peVar90 = (peVar90->out_link).prev;
  goto LAB_0015ca23;
LAB_0015cdd3:
  pbVar39 = (local_e8->bb_link).next;
  if (pbVar39 == (bb_t)0x0) goto code_r0x0015cde5;
  goto LAB_0015c9af;
  while( true ) {
    pMVar51 = pgVar76->ctx;
    pMVar69 = (MIR_context_t)((long)&pMVar51->gen_ctx + 1);
    if (*(MIR_context_t *)&pgVar76->optimize_level < pMVar69) {
      bb = (char *)((long)&pMVar69->gen_ctx + ((ulong)pMVar69 >> 1));
      pVStack_130 = (bitmap_t)0x15cd78;
      pMVar31 = (MIR_item_t)realloc(pMVar31,(long)bb * 0x10);
      pgVar76->curr_func_item = pMVar31;
      *(char **)&pgVar76->optimize_level = bb;
      pMVar51 = pgVar76->ctx;
      pMVar69 = (MIR_context_t)((long)&pMVar51->gen_ctx + 1);
    }
    uVar72 = uVar62 & 0xffffffff;
    pgVar76->ctx = pMVar69;
    uVar62 = uVar62 + 1;
    local_f0 = (MIR_context_t)((ulong)local_f0 & 0xffffff0000000000 | uVar72);
    (&pMVar31->data)[(long)pMVar51 * 2] = local_f0;
    (&pMVar31->module)[(long)pMVar51 * 2] = (MIR_module_t)pMVar43;
    pMVar52 = (MIR_insn_t)(uVar62 >> 6);
    pMVar84 = pbVar81->insn;
    if (pMVar84 <= pMVar52) break;
LAB_0015ccea:
    while ((uVar72 = *(ulong *)(*(long *)&pbVar81->mem_index + (long)pMVar52 * 8), uVar72 == 0 ||
           (uVar72 = uVar72 >> (uVar62 & 0x3f), uVar72 == 0))) {
      pMVar52 = (MIR_insn_t)((long)&pMVar52->data + 1);
      uVar62 = (long)pMVar52 * 0x40;
      if (pMVar84 == pMVar52) goto LAB_0015ccdd;
    }
    uVar79 = uVar72 & 1;
    while (uVar79 == 0) {
      uVar62 = uVar62 + 1;
      uVar79 = uVar72 & 2;
      uVar72 = uVar72 >> 1;
    }
    if (uVar62 < 0x22) {
LAB_0015e321:
      pVStack_130 = (bitmap_t)0x15e340;
      __assert_fail("nel > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x205d,"void collect_spill_els(gen_ctx_t)");
    }
    pgVar76 = (gen_ctx_t)gen_ctx->ra_ctx->spill_els;
    pMVar31 = pgVar76->curr_func_item;
    if (pMVar31 == (MIR_item_t)0x0) {
      pVStack_130 = (bitmap_t)0x15e345;
      reg_alloc_cold_29();
      goto LAB_0015e345;
    }
  }
LAB_0015ccdd:
  pMVar43 = ((DLIST_MIR_item_t *)&pMVar43->item_link)->head;
  goto LAB_0015cb71;
LAB_0015e79e:
  pgVar76 = (gen_ctx_t)pbVar39->out;
  pgVar86 = pgVar85;
  bitmap_copy((bitmap_t)pgVar85,(const_bitmap_t)pgVar76);
  bb_insn = (gen_ctx_t)(pbVar39->bb_insns).tail;
  pbStack_188 = pbVar39;
  while (bb_insn != (gen_ctx_t)0x0) {
    pgStack_170 = (gen_ctx_t)((DLIST_LINK_bb_t *)&bb_insn->debug_level)->prev;
    pgVar76 = bb_insn;
    pgVar86 = pgVar67;
    clear_bb_insn_dead_vars(pgVar67,(bb_insn_t_conflict)bb_insn);
    pgVar42 = (gen_ctx *)bb_insn->ctx;
    uVar62 = (ulong)pgVar42->debug_file >> 0x20;
    pgStack_1b0 = bb_insn;
    if (uVar62 != 0) {
      sVar89 = 0;
      do {
        pgVar86 = (gen_ctx_t)pgVar67->ctx;
        pgVar76 = pgVar42;
        MIR_insn_op_mode((MIR_context_t)pgVar86,(MIR_insn_t_conflict)pgVar42,sVar89,&iStack_1b4);
        if (iStack_1b4 != 0) {
          if (*(char *)(pgVar42->call_used_hard_regs + sVar89 * 6 + -8) == '\x02') {
            pgVar86 = (gen_ctx_t)pgVar67->lr_ctx;
            pgVar76 = (gen_ctx_t)(ulong)*(uint *)(pgVar42->call_used_hard_regs + sVar89 * 6 + -7);
            uVar70 = var_to_scan_var(pgVar86,*(uint *)(pgVar42->call_used_hard_regs +
                                                      sVar89 * 6 + -7));
            if ((-1 < (int)uVar70) && ((ulong)uVar70 < (ulong)((long)pgVar85->ctx << 6))) {
              bVar16 = (byte)uVar70 & 0x3f;
              pgVar76 = (gen_ctx_t)(-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
              ppvVar87 = &pgVar85->curr_func_item->data + (uVar70 >> 6);
              *ppvVar87 = (void *)((ulong)*ppvVar87 & (ulong)pgVar76);
            }
          }
          else if (*(char *)(pgVar42->call_used_hard_regs + sVar89 * 6 + -8) != '\v') {
            __assert_fail("op_ref->mode == MIR_OP_VAR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x4ff,
                          "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                         );
          }
        }
        sVar89 = sVar89 + 1;
      } while (sVar89 < uVar62);
    }
    pFVar75 = pgVar42->debug_file;
    if ((pgVar67->lr_ctx->scan_vars_num == 0) && (0xfffffffc < (int)pFVar75 - 0xaaU)) {
      pgVar76 = pgVar85;
      pgVar86 = pgVar85;
      bitmap_and_compl((bitmap_t)pgVar85,(bitmap_t)pgVar85,pgVar67->call_used_hard_regs[0x12]);
      pFVar75 = pgVar42->debug_file;
    }
    uVar62 = (ulong)pFVar75 >> 0x20;
    if (uVar62 != 0) {
      pDStack_168 = (DLIST_LINK_bb_t *)&pgVar42->debug_level;
      uVar79 = 0;
      uVar72 = 0;
      auStack_1a4._4_8_ = &pgStack_1b0->tied_regs;
      auStack_1a4._12_8_ = pgVar42;
      sVar89 = uVar72;
      uStack_160 = uVar62;
      pDVar19 = pDStack_168;
LAB_0015e8e7:
      do {
        sStack_190 = sVar89;
        pgVar86 = (gen_ctx_t)pgVar67->ctx;
        pgVar76 = pgVar42;
        MIR_insn_op_mode((MIR_context_t)pgVar86,(MIR_insn_t_conflict)pgVar42,sStack_190,&iStack_1b4)
        ;
        if ((iStack_1b4 == 0) || (*(char *)&pDVar19[uVar72 * 3].next == '\v')) {
          if (uVar79 < 2) {
            if (*(char *)&pDVar19[uVar72 * 3].next == '\v') {
              do {
                uVar70 = *(uint *)((long)&pDVar19[uVar72 * 3 + 2].prev + (ulong)(uVar79 != 0) * 4);
                if (uVar70 != 0xffffffff) {
                  uVar79 = uVar79 + 1;
                  goto LAB_0015e964;
                }
                bVar92 = uVar79 == 0;
                uVar79 = 1;
                pgVar42 = (gen_ctx *)auStack_1a4._12_8_;
              } while (bVar92);
            }
            else if (uVar79 != 1) {
              uVar79 = 0;
              if (*(char *)&pDVar19[uVar72 * 3].next != '\x02') goto LAB_0015ea9d;
              uVar70 = *(uint *)&pDVar19[uVar72 * 3 + 1].prev;
              uVar79 = 1;
LAB_0015e964:
              pgVar86 = (gen_ctx_t)pgVar67->lr_ctx;
              pgVar76 = (gen_ctx_t)(ulong)uVar70;
              uVar20 = var_to_scan_var(pgVar86,uVar70);
              if (-1 < (int)uVar20) {
                pgVar86 = pgVar85;
                bitmap_expand((bitmap_t)pgVar85,(ulong)uVar20 + 1);
                uVar62 = uStack_160;
                pvVar45 = (&pgVar85->curr_func_item->data)[uVar20 >> 6];
                pgVar76 = (gen_ctx_t)((ulong)pvVar45 | 1L << ((ulong)uVar20 & 0x3f));
                (&pgVar85->curr_func_item->data)[uVar20 >> 6] = pgVar76;
                if (((ulong)pvVar45 >> ((ulong)uVar20 & 0x3f) & 1) == 0) {
                  for (peVar41 = *(in_edge_t *)auStack_1a4._4_8_; peVar41 != (in_edge_t)0x0;
                      peVar41 = (peVar41->in_link).prev) {
                    if (*(uint *)&peVar41->src == uVar70) goto LAB_0015ea7c;
                  }
                  pgVar42 = (gen_ctx *)pgStack_178->ctx;
                  if (pgVar42 == (gen_ctx *)0x0) {
                    pgVar76 = (gen_ctx_t)&DAT_00000018;
                    pgVar86 = pgVar67;
                    pgVar42 = (gen_ctx *)gen_malloc(pgVar67,0x18);
                  }
                  else {
                    pbVar49 = *(bb_t *)&pgVar42->optimize_level;
                    pgVar47 = (gen_ctx *)((DLIST_LINK_in_edge_t *)&pgVar42->curr_func_item)->prev;
                    pgVar86 = (gen_ctx_t)&pbVar49->rpost;
                    if (pbVar49 == (bb_t)0x0) {
                      pgVar86 = pgStack_178;
                    }
                    pgVar86->ctx = (MIR_context_t)pgVar47;
                    if (pgVar47 == (gen_ctx *)0x0) {
                      ppbVar60 = ppbStack_180;
                      if ((gen_ctx *)*ppbStack_180 != pgVar42) goto LAB_0015ebda;
                    }
                    else {
                      ppbVar60 = (bb_t *)&pgVar47->optimize_level;
                    }
                    pgVar76 = (gen_ctx_t)&pgVar42->optimize_level;
                    *ppbVar60 = pbVar49;
                    *(size_t *)pgVar76 = 0;
                    pgVar42->curr_func_item = (MIR_item_t)0x0;
                    pgVar86 = pgStack_178;
                  }
                  *(uint *)&pgVar42->ctx = uVar70;
                  pbVar49 = (bb_t)((DLIST_out_edge_t *)&pgStack_1b0->addr_regs)->head;
                  if (pbVar49 == (bb_t)0x0) {
                    pDVar54 = (DLIST_LINK_in_edge_t *)auStack_1a4._4_8_;
                    if (*(in_edge_t *)auStack_1a4._4_8_ != (in_edge_t)0x0) goto LAB_0015ebd5;
                  }
                  else {
                    if (((DLIST_LINK_in_edge_t *)&pbVar49->rpost)->prev != (in_edge_t)0x0) {
                      add_bb_insn_dead_vars_cold_2();
LAB_0015ebd5:
                      add_bb_insn_dead_vars_cold_3();
LAB_0015ebda:
                      add_bb_insn_dead_vars_cold_1();
LAB_0015ebdf:
                      __assert_fail("gen_ctx->optimize_level > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1802,"void add_bb_insn_dead_vars(gen_ctx_t)");
                    }
                    pDVar54 = (DLIST_LINK_in_edge_t *)&pbVar49->rpost;
                  }
                  pDVar54->prev = (in_edge_t)pgVar42;
                  ((DLIST_LINK_in_edge_t *)&pgVar42->curr_func_item)->prev = (in_edge_t)0x0;
                  *(bb_t *)&pgVar42->optimize_level = pbVar49;
                  ((DLIST_out_edge_t *)&pgStack_1b0->addr_regs)->head = (out_edge_t)pgVar42;
                }
              }
LAB_0015ea7c:
              pgVar42 = (gen_ctx *)auStack_1a4._12_8_;
              sVar89 = sStack_190;
              if (uVar62 <= sStack_190) break;
              goto LAB_0015e8e7;
            }
          }
          uVar79 = 0;
        }
LAB_0015ea9d:
        uVar72 = sStack_190 + 1;
        sVar89 = uVar72;
        pDVar19 = pDStack_168;
      } while (uVar72 < uVar62);
    }
    bb_insn = pgStack_170;
    if (pgVar67->lr_ctx->scan_vars_num == 0) {
      pgVar86 = (gen_ctx_t)pgVar42->debug_file;
      pgVar76 = (gen_ctx_t)auStack_1a4;
      target_get_early_clobbered_hard_regs((MIR_insn_t)pgVar86,(MIR_reg_t *)pgVar76,&uStack_1a8);
      if (((ulong)(uint)auStack_1a4._0_4_ != 0xffffffff) &&
         ((ulong)(uint)auStack_1a4._0_4_ < (ulong)((long)pgVar85->ctx << 6))) {
        bVar16 = (byte)auStack_1a4._0_4_ & 0x3f;
        pgVar76 = (gen_ctx_t)(-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
        ppvVar87 = &pgVar85->curr_func_item->data + ((uint)auStack_1a4._0_4_ >> 6);
        *ppvVar87 = (void *)((ulong)*ppvVar87 & (ulong)pgVar76);
      }
      if (((ulong)uStack_1a8 != 0xffffffff) &&
         ((ulong)uStack_1a8 < (ulong)((long)pgVar85->ctx << 6))) {
        bVar16 = (byte)uStack_1a8 & 0x3f;
        pgVar76 = (gen_ctx_t)(-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
        ppvVar87 = &pgVar85->curr_func_item->data + (uStack_1a8 >> 6);
        *ppvVar87 = (void *)((ulong)*ppvVar87 & (ulong)pgVar76);
      }
      bb_insn = pgStack_170;
      if (0xfffffffc < *(int *)&pgVar42->debug_file - 0xaaU) {
        pgVar76 = pgVar85;
        pgVar86 = pgVar85;
        bitmap_ior((bitmap_t)pgVar85,(bitmap_t)pgVar85,(bitmap_t)pgStack_1b0->insn_to_consider);
        bb_insn = pgStack_170;
      }
    }
  }
  pbVar39 = (pbStack_188->bb_link).next;
  if (pbVar39 == (bb_t)0x0) {
    pMVar31 = pgVar85->curr_func_item;
LAB_0015eb8c:
    if (pMVar31 != (MIR_item_t)0x0) {
      free(pMVar31);
      free(pgVar85);
      return;
    }
    add_bb_insn_dead_vars_cold_4();
    if (pgVar86->lr_ctx->scan_vars_num == 0) {
      reg_map = (MIR_reg_t *)0x0;
    }
    else {
      pVVar9 = pgVar86->lr_ctx->scan_var_to_var_map;
      if (pVVar9 == (VARR_MIR_reg_t *)0x0) {
        output_bb_live_info_cold_1();
        pgVar42 = (gen_ctx *)gen_malloc(pgVar86,0xa8);
        pgVar42->call_used_hard_regs[6] = (bitmap_t)0x0;
        pMVar43 = (MIR_item_t_conflict)malloc(0x18);
        pMVar43->data = (void *)0x0;
        pgVar42->debug_file = (FILE *)0x0;
        *(c2mir_ctx **)&pgVar42->optimize_level = (c2mir_ctx *)0x0;
        pgVar42->curr_func_item = (MIR_item_t)0x0;
        pMVar43->module = (MIR_module_t)0x4;
        *(undefined1 (*) [32])&pgVar42->addr_insn_p = ZEXT432(0) << 0x40;
        *(undefined1 (*) [32])((long)&pgVar42->addr_regs + 3) = ZEXT432(0) << 0x40;
        pMVar31 = (MIR_item_t)malloc(0x20);
        (pMVar43->item_link).prev = pMVar31;
        pgVar42->call_used_hard_regs[0] = (bitmap_t)pMVar43;
        puVar44 = (undefined8 *)malloc(0x18);
        *puVar44 = 0;
        puVar44[1] = 4;
        pvVar45 = malloc(0x20);
        puVar44[2] = pvVar45;
        pgVar42->call_used_hard_regs[1] = (bitmap_t)puVar44;
        puVar44 = (undefined8 *)malloc(0x18);
        *puVar44 = 0;
        puVar44[1] = 4;
        pvVar45 = malloc(0x20);
        puVar44[2] = pvVar45;
        pgVar42->call_used_hard_regs[2] = (bitmap_t)puVar44;
        puVar44 = (undefined8 *)malloc(0x18);
        *puVar44 = 0;
        puVar44[1] = 4;
        pvVar45 = malloc(0x20);
        puVar44[2] = pvVar45;
        pgVar42->call_used_hard_regs[3] = (bitmap_t)puVar44;
        puVar44 = (undefined8 *)malloc(0x18);
        *puVar44 = 0;
        puVar44[1] = 4;
        pvVar45 = malloc(0x20);
        puVar44[2] = pvVar45;
        pgVar42->call_used_hard_regs[4] = (bitmap_t)puVar44;
        puVar44 = (undefined8 *)malloc(0x18);
        *puVar44 = 0;
        puVar44[1] = 4;
        pvVar45 = malloc(0x20);
        pgVar42->call_used_hard_regs[5] = (bitmap_t)puVar44;
        puVar44[2] = pvVar45;
        pgVar42->call_used_hard_regs[7] = (bitmap_t)0x0;
        if (pgVar76 != (gen_ctx_t)0x0) {
          if (pgVar86->optimize_level == 0) {
            uVar70 = *(int *)&pgVar76->debug_file - 0xa7;
            if ((uVar70 < 0xe) && ((0x2007U >> (uVar70 & 0x1f) & 1) != 0)) {
              pgVar47 = (gen_ctx *)gen_malloc(pgVar86,0x10);
              pgVar76->ctx = (MIR_context_t)pgVar47;
              pgVar47->ctx = (MIR_context_t)pgVar42;
              *(undefined8 *)&pgVar47->optimize_level = 0;
            }
            else {
              pgVar76->ctx = (MIR_context_t)pgVar42;
            }
          }
          else {
            pbVar46 = create_bb_insn(pgVar86,(MIR_insn_t)pgVar76,(bb_t_conflict)pgVar42);
            DLIST_bb_insn_t_append((DLIST_bb_insn_t *)&pgVar42->temp_bitmap,pbVar46);
          }
        }
        return;
      }
      reg_map = pVVar9->varr;
    }
    output_bb_border_live_info(pgVar86,(bb_t_conflict)pgVar76);
    output_bitmap(pgVar86,"  live_gen:",pgVar76->call_used_hard_regs[2],1,reg_map);
    output_bitmap(pgVar86,"  live_kill:",pgVar76->call_used_hard_regs[3],1,reg_map);
    return;
  }
  goto LAB_0015e79e;
LAB_0015e2f3:
  pVStack_130 = (bitmap_t)0x15e2f8;
  reg_alloc_cold_81();
LAB_0015e2f8:
  pVStack_130 = (bitmap_t)0x15e2fd;
  reg_alloc_cold_77();
LAB_0015e2fd:
  pVStack_130 = (bitmap_t)0x15e31c;
  __assert_fail("nel > ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x204d,"void collect_spill_els(gen_ctx_t)");
code_r0x0015cde5:
  pVVar40 = gen_ctx->ra_ctx->spill_els;
LAB_0015cdf3:
  if (pVVar40 == (VARR_spill_el_t *)0x0) goto LAB_0015e5da;
  sVar89 = pVVar40->els_num;
  psVar30 = pVVar40->varr;
LAB_0015ce07:
  pVStack_130 = (bitmap_t)0x15ce20;
  local_a8 = psVar30;
  qsort(psVar30,sVar89,0x10,spill_el_sort_cmp);
  pgVar86 = pgVar76;
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) &&
     (1 < *(int *)&((DLIST_LINK_bb_t *)&local_f8->debug_level)->prev)) {
    pVStack_130 = (bitmap_t)0x15ce52;
    fwrite(" Spills on edges:\n",0x12,1,(FILE *)gen_ctx->debug_file);
    pgVar86 = local_f8;
    pVVar40 = local_f8->ra_ctx->spill_els;
    if (pVVar40 != (VARR_spill_el_t *)0x0) {
      uVar62 = 0xffffffffffffffff;
      paVar35 = &local_a8->u;
      do {
        uVar62 = uVar62 + 1;
        if (pVVar40->els_num <= uVar62) goto LAB_0015cf14;
        if (*(char *)((long)paVar35 + -3) == '\0') {
LAB_0015e411:
          pVStack_130 = (bitmap_t)0x15e430;
          __assert_fail("spill_els_addr[i].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x20f1,"void split(gen_ctx_t)");
        }
        pcVar58 = "spill";
        bb = (char *)(paVar35 + 2);
        if (*(char *)((long)paVar35 + -4) == '\0') {
          pcVar58 = "restore";
        }
        local_128 = (MIR_context_t)paVar35->e->dst->index;
        pVStack_130 = (bitmap_t)0x15cef8;
        fprintf((FILE *)pgVar86->debug_file,"  %s r%d on %s of edge bb%lu->bb%lu\n",pcVar58,
                (ulong)((spill_el_t *)(paVar35 + -1))->reg);
        pVVar40 = pgVar86->ra_ctx->spill_els;
        paVar35 = (anon_union_8_2_0ec0d2a8_for_u *)bb;
        pgVar76 = pgVar86;
      } while (pVVar40 != (VARR_spill_el_t *)0x0);
    }
    pgVar86 = pgVar76;
    pVStack_130 = (bitmap_t)0x15cf14;
    reg_alloc_cold_34();
  }
LAB_0015cf14:
  auVar94 = in_ZMM2._0_16_;
  auVar95 = in_ZMM0._0_16_;
  pVVar40 = local_f8->ra_ctx->spill_els;
  if (pVVar40 == (VARR_spill_el_t *)0x0) {
    pVStack_130 = (bitmap_t)0x15e588;
    reg_alloc_cold_67();
    goto LAB_0015e588;
  }
  if (pVVar40->els_num == 0) {
    sVar89 = 0;
  }
  else {
    bb = (char *)pVVar40->varr;
    pbVar81 = ((DLIST_bb_insn_t *)&local_f8->temp_bitmap)->head;
    pbVar39 = (local_f8->curr_cfg->bbs).head;
    local_e8 = (bb_t)bb;
    if (pbVar39 != (bb_t_conflict)0x0) {
      iVar61 = -1;
      do {
        pbVar39 = (pbVar39->bb_link).next;
        if (pbVar39 == (bb_t)0x0) break;
        bVar92 = iVar61 != 0;
        iVar61 = iVar61 + 1;
      } while (bVar92);
      do {
        if (pbVar39 == (bb_t)0x0) break;
        pVVar66 = pbVar39->kill;
        if ((pVVar66 == (bitmap_t)0x0) || (pVVar66->varr == (bitmap_el_t *)0x0)) {
LAB_0015e3e3:
          pVStack_130 = (bitmap_t)0x15e3e8;
          reg_alloc_cold_36();
          goto LAB_0015e3e8;
        }
        pVVar66->els_num = 0;
        pVVar66 = pbVar39->gen;
        if ((pVVar66 == (bitmap_t)0x0) || (pVVar66->varr == (bitmap_el_t *)0x0)) {
          pVStack_130 = (bitmap_t)0x15e3e3;
          reg_alloc_cold_35();
          goto LAB_0015e3e3;
        }
        pVVar66->els_num = 0;
        for (peVar36 = (pbVar39->out_edges).head; peVar36 != (out_edge_t)0x0;
            peVar36 = (peVar36->out_link).next) {
          peVar36->flag1 = '\0';
          peVar36->flag2 = '\0';
        }
        pbVar39 = (pbVar39->bb_link).next;
      } while( true );
    }
    pgVar76 = (gen_ctx_t)0x0;
    do {
      if (*(char *)((long)&((bb_t)bb)->index + 5) == '\0') goto LAB_0015e391;
      peVar90 = ((anon_union_8_2_0ec0d2a8_for_u *)&((bb_t)bb)->pre)->e;
      bVar92 = true;
      if ((*(char *)((long)&((bb_t)bb)->index + 4) == '\0') &&
         (((iVar61 = (int)*(undefined8 *)&((peVar90->src->bb_insns).tail)->insn->field_0x18,
           0xffffffd0 < iVar61 - 0xa5U || (iVar61 == 0xaa)) || (iVar61 == 0xa6)))) {
        bVar92 = iVar61 == 0x76;
      }
      peVar90->flag1 = bVar92;
      peVar90->flag2 = '\x01';
      uVar70 = *(uint *)&((bb_t)bb)->index;
      pVVar66 = peVar90->src->kill;
      pVStack_130 = (bitmap_t)0x15d042;
      bitmap_expand(pVVar66,(ulong)uVar70 + 1);
      if (pVVar66 == (bitmap_t)0x0) {
        pVStack_130 = (bitmap_t)0x15e3b5;
        reg_alloc_cold_62();
LAB_0015e3b5:
        pVStack_130 = (bitmap_t)0x15e3ba;
        reg_alloc_cold_61();
LAB_0015e3ba:
        pVStack_130 = (bitmap_t)0x15e3bf;
        reg_alloc_cold_60();
LAB_0015e3bf:
        pVStack_130 = (bitmap_t)0x15e3de;
        __assert_fail("bitmap_bit_p (bb->kill, reg)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x201b,"void rewrite(gen_ctx_t)");
      }
      pVVar66->varr[uVar70 >> 6] = pVVar66->varr[uVar70 >> 6] | 1L << ((ulong)uVar70 & 0x3f);
      uVar70 = *(uint *)&((bb_t)bb)->index;
      pVVar66 = peVar90->dst->gen;
      pVStack_130 = (bitmap_t)0x15d080;
      bitmap_expand(pVVar66,(ulong)uVar70 + 1);
      auVar94 = in_ZMM2._0_16_;
      auVar95 = in_ZMM0._0_16_;
      if (pVVar66 == (bitmap_t)0x0) goto LAB_0015e3b5;
      pVVar66->varr[uVar70 >> 6] = pVVar66->varr[uVar70 >> 6] | 1L << ((ulong)uVar70 & 0x3f);
      prVar38 = local_f8->ra_ctx;
      pgVar85 = (gen_ctx_t)prVar38->lr_gap_bitmaps[0x23];
      if (pgVar85 == (gen_ctx_t)0x0) goto LAB_0015e3ba;
      pgVar86 = (gen_ctx_t)pgVar85->ctx;
      pgVar76 = (gen_ctx_t)((long)&pgVar76->ctx + 1);
      bb = (char *)&((bb_t)bb)->rpost;
    } while (pgVar76 < pgVar86);
    if (pgVar86 == (gen_ctx_t)0x0) {
LAB_0015dfa5:
      pVVar40 = (VARR_spill_el_t *)prVar38->lr_gap_bitmaps[0x23];
      if (pVVar40 == (VARR_spill_el_t *)0x0) {
        pVStack_130 = (bitmap_t)0x15e606;
        reg_alloc_cold_59();
LAB_0015e606:
        pVStack_130 = (bitmap_t)0x15e60b;
        reg_alloc_cold_54();
LAB_0015e60b:
        pVStack_130 = (bitmap_t)0x15e610;
        reg_alloc_cold_52();
LAB_0015e610:
        pVStack_130 = (bitmap_t)0x15e615;
        reg_alloc_cold_53();
LAB_0015e615:
        pVStack_130 = (bitmap_t)0x15e61a;
        reg_alloc_cold_55();
LAB_0015e61a:
        pVStack_130 = (bitmap_t)0x15e63c;
        __assert_fail("first_insn->code == MIR_LABEL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x3b9,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
      }
    }
    else {
      if (pbVar81 == (bb_insn_t)0x0) {
LAB_0015e3e8:
        pVStack_130 = (bitmap_t)0x15e3ed;
        reg_alloc_cold_58();
LAB_0015e3ed:
        pVStack_130 = (bitmap_t)0x15e40c;
        __assert_fail("(DLIST_bb_insn_t_head (&(bb->bb_insns))) != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x2041,"void collect_spill_els(gen_ctx_t)");
      }
      __ptr_01 = *(ra_ctx **)&pbVar81->mem_index;
      bb = (char *)0x0;
      prVar34 = __ptr_01;
      do {
        if (__ptr_01 == (ra_ctx *)0x0) goto LAB_0015e3e8;
        local_f0 = (MIR_context_t)((anon_union_8_2_0ec0d2a8_for_u *)&local_e8->pre)[(long)bb * 2].e;
        pbVar81->insn = (MIR_insn_t)0x0;
        if ((bb < pgVar86) &&
           (local_f0 ==
            (MIR_context_t)((anon_union_8_2_0ec0d2a8_for_u *)&local_e8->pre)[(long)bb * 2].e)) {
          pDVar53 = (DLIST_LINK_MIR_item_t *)(&local_e8->index + (long)bb * 2);
          do {
            uVar70 = *(uint *)&pDVar53->prev;
            pMVar84 = (MIR_insn_t)((ulong)uVar70 + 0x40 >> 6);
            lVar88 = (long)pMVar84 - (long)pbVar81->insn;
            if (pbVar81->insn <= pMVar84 && lVar88 != 0) {
              do {
                pMVar52 = pbVar81->insn;
                pMVar84 = (MIR_insn_t)((long)&pMVar52->data + 1);
                if (*(MIR_insn_t *)&pbVar81->gvn_val_const_p < pMVar84) {
                  lVar73 = (long)pMVar84->ops + (((ulong)pMVar84 >> 1) - 0x20);
                  pVStack_130 = (bitmap_t)0x15d306;
                  prVar34 = (ra_ctx *)realloc(__ptr_01,lVar73 * 8);
                  *(ra_ctx **)&pbVar81->mem_index = prVar34;
                  *(long *)&pbVar81->gvn_val_const_p = lVar73;
                  pMVar52 = pbVar81->insn;
                  pMVar84 = (MIR_insn_t)((long)&pMVar52->data + 1);
                  __ptr_01 = prVar34;
                }
                lVar88 = lVar88 + -1;
                pbVar81->insn = pMVar84;
                __ptr_01->lr_gap_bitmaps[(long)(&pMVar52[-1].ops[0].u.reg + 6)] = (bitmap_t)0x0;
              } while (lVar88 != 0);
              prVar38 = local_f8->ra_ctx;
            }
            prVar34->lr_gap_bitmaps[(ulong)(uVar70 >> 6) - 8] =
                 (bitmap_t)
                 ((ulong)prVar34->lr_gap_bitmaps[(ulong)(uVar70 >> 6) - 8] |
                 1L << ((ulong)uVar70 & 0x3f));
            pgVar85 = (gen_ctx_t)prVar38->lr_gap_bitmaps[0x23];
            if (pgVar85 == (gen_ctx_t)0x0) goto LAB_0015e354;
            pgVar86 = (gen_ctx_t)pgVar85->ctx;
            ppgVar18 = (gen_ctx **)&((gen_ctx_t)bb)->ctx;
            bb = (char *)((long)ppgVar18 + 1);
            __ptr_01 = prVar34;
          } while ((bb < pgVar86) &&
                  (pDVar53 = (DLIST_LINK_MIR_item_t *)&local_e8->rpost + (long)ppgVar18,
                  local_f0 == (MIR_context_t)(&local_e8->bfs)[(long)ppgVar18 * 2]));
        }
        pMVar69 = local_f0;
        if (*(char *)((long)&local_f0->temp_string + 2) != '\0') {
          pVVar66 = local_f0->gen_ctx->addr_regs;
          for (pVVar13 = pVVar66; pVVar13 != (bitmap_t)0x0; pVVar13 = (bitmap_t)pVVar13[1].varr) {
            if (*(char *)((long)&pVVar13[2].els_num + 2) == '\0') goto LAB_0015d1ea;
          }
          pbVar32 = (bb_insn_t)local_f0->gen_ctx->call_used_hard_regs[3];
          if (pbVar32 == (bb_insn_t)0x0) goto LAB_0015e4a2;
          pMVar69 = (MIR_context_t)pbVar81->insn;
          local_c8 = (MIR_context_t)pbVar32->insn;
          pMVar51 = pMVar69;
          __s1 = __ptr_01;
          if (local_c8 < pMVar69) {
            puVar2 = &pbVar32->mem_index;
            pbVar32 = pbVar81;
            pMVar51 = local_c8;
            __s1 = *(ra_ctx **)puVar2;
            local_c8 = pMVar69;
          }
          local_b8 = *(bb_insn_t *)&pbVar32->mem_index;
          pVStack_130 = (bitmap_t)0x15d1aa;
          local_e0 = pgVar85;
          local_d8 = __ptr_01;
          local_d0 = prVar38;
          iVar61 = bcmp(__s1,local_b8,(long)pMVar51 * 8);
          pMVar69 = local_f0;
          prVar38 = local_d0;
          pgVar85 = local_e0;
          __ptr_01 = local_d8;
          if (iVar61 == 0) {
            if (pMVar51 < local_c8) {
              do {
                if ((&local_b8->insn)[(long)pMVar51] != (MIR_insn_t)0x0) goto LAB_0015d1ea;
                pMVar51 = (MIR_context_t)((long)&pMVar51->gen_ctx + 1);
              } while (local_c8 != pMVar51);
            }
          }
          else {
LAB_0015d1ea:
            for (; pVVar66 != (bitmap_t)0x0; pVVar66 = (bitmap_t)pVVar66[1].varr) {
              *(undefined1 *)((long)&pVVar66[2].els_num + 2) = 0;
            }
          }
        }
        if (*(char *)((long)&pMVar69->temp_string + 3) != '\0') {
          pMVar84 = ((DLIST_LINK_MIR_insn_t *)&pMVar69->c2mir_ctx)->prev;
          pMVar31 = pMVar84->ops[0].u.ref;
          for (pMVar14 = pMVar31; pMVar14 != (MIR_item_t)0x0; pMVar14 = (pMVar14->item_link).next) {
            if (*(char *)((long)&pMVar14->addr + 3) == '\0') goto LAB_0015d2b1;
          }
          pbVar32 = *(bb_insn_t *)&pMVar84[1].ops[0].field_0x8;
          if (pbVar32 == (bb_insn_t)0x0) goto LAB_0015e4a7;
          pMVar69 = (MIR_context_t)pbVar81->insn;
          local_f0 = (MIR_context_t)pbVar32->insn;
          pbVar33 = pbVar81;
          pMVar51 = pMVar69;
          if (local_f0 < pMVar69) {
            pbVar33 = pbVar32;
            pbVar32 = pbVar81;
            pMVar51 = local_f0;
            local_f0 = pMVar69;
          }
          local_c8 = *(MIR_context_t *)&pbVar32->mem_index;
          pVStack_130 = (bitmap_t)0x15d276;
          local_e0 = pgVar85;
          local_d8 = __ptr_01;
          local_d0 = prVar38;
          iVar61 = bcmp(*(void **)&pbVar33->mem_index,local_c8,(long)pMVar51 * 8);
          prVar38 = local_d0;
          pgVar85 = local_e0;
          __ptr_01 = local_d8;
          if (iVar61 == 0) {
            if (pMVar51 < local_f0) {
              do {
                if ((&local_c8->gen_ctx)[(long)pMVar51] != (gen_ctx *)0x0) goto LAB_0015d2b1;
                pMVar51 = (MIR_context_t)((long)&pMVar51->gen_ctx + 1);
              } while (local_f0 != pMVar51);
            }
          }
          else {
LAB_0015d2b1:
            for (; pMVar31 != (MIR_item_t)0x0; pMVar31 = (pMVar31->item_link).next) {
              *(undefined1 *)((long)&pMVar31->addr + 3) = 0;
            }
          }
        }
        auVar94 = in_ZMM2._0_16_;
        auVar95 = in_ZMM0._0_16_;
      } while (bb < pgVar86);
      if (pgVar86 != (gen_ctx_t)0x0) {
        paVar35 = (anon_union_8_2_0ec0d2a8_for_u *)&local_e8->pre;
        do {
          peVar90 = paVar35->e;
          if ((peVar90->flag1 != '\0') && (peVar90->flag2 != '\0')) {
            if ((peVar90->src->out_edges).head == (peVar90->src->out_edges).tail) {
              peVar90->flag1 = '\0';
            }
            else if ((peVar90->dst->in_edges).head == (peVar90->dst->in_edges).tail) {
              peVar90->flag2 = '\0';
            }
          }
          paVar35 = paVar35 + 2;
          pgVar86 = (gen_ctx_t)((long)&pgVar86[-1].spot_attrs + 7);
        } while (pgVar86 != (gen_ctx_t)0x0);
      }
      if (pgVar85->ctx == (MIR_context_t)0x0) goto LAB_0015dfa5;
      local_f0 = (MIR_context_t)(ulong)local_f8->curr_bb_index;
      uVar62 = 0;
      pbVar49 = local_e8;
      do {
        if (*(char *)((long)&pbVar49->index + uVar62 * 0x10 + 5) == '\0') {
          pVStack_130 = (bitmap_t)0x15e49a;
          __assert_fail("spill_els_addr[n].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x20c3,"void transform_edge_to_bb_placement(gen_ctx_t)");
        }
        ppvVar87 = (void **)(&pbVar49->index + uVar62 * 2);
        peVar90 = ((anon_union_8_2_0ec0d2a8_for_u *)(ppvVar87 + 1))->e;
        *(undefined2 *)((long)ppvVar87 + 5) = 0;
        if (peVar90->flag1 == '\0') {
          if (peVar90->flag2 == '\0') {
            pgVar86 = (gen_ctx_t)peVar90->src;
            if (pgVar86->ctx < local_f0) {
              pgVar76 = (gen_ctx_t)peVar90->dst;
              if (pgVar76->ctx < local_f0) {
                pbVar81 = (bb_insn_t)pgVar86->temp_bitmap2;
                pbVar46 = ((DLIST_bb_insn_t *)&pgVar76->temp_bitmap)->head;
                local_d0 = (ra_ctx *)pbVar81->insn;
                pMVar69 = local_f8->ctx;
                prVar38 = (ra_ctx *)pbVar46->insn;
                local_e0 = pgVar76;
                if (((FILE *)local_f8->debug_file != (FILE *)0x0) &&
                   (3 < *(int *)&((DLIST_LINK_bb_t *)&local_f8->debug_level)->prev)) {
                  in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
                  in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                  pVStack_130 = (bitmap_t)0x15d4d5;
                  local_d8 = prVar38;
                  local_c8 = pMVar69;
                  local_b8 = pbVar81;
                  fprintf((FILE *)local_f8->debug_file,"    Splitting bb%lu->bb%lu:\n");
                  prVar38 = local_d8;
                  pbVar81 = local_b8;
                  pMVar69 = local_c8;
                }
                pgVar85 = local_e0;
                pgVar76 = local_f8;
                auVar95 = in_ZMM2._0_16_;
                if (((DLIST_out_edge_t *)&pgVar86->addr_regs)->head ==
                    (out_edge_t)pgVar86->insn_to_consider) {
                  if (peVar90->fall_through_p != '\0') goto LAB_0015d64a;
                  bb = (char *)pgVar86;
                  if (((DLIST_in_edge_t *)&pgVar86->addr_insn_p)->head !=
                      (in_edge_t_conflict)pgVar86->tied_regs) {
                    if ((1 < *(int *)&local_d0->used_locs - 0xabU) &&
                       (*(int *)&local_d0->used_locs != 0x76)) goto LAB_0015e6bd;
                    in_ZMM2 = ZEXT1664(auVar95);
                    pVStack_130 = (bitmap_t)0x15d83a;
                    delete_bb_insn(local_f8,pbVar81);
                    goto LAB_0015d680;
                  }
                }
                else {
                  if (peVar90->fall_through_p == '\0') {
                    peVar41 = *(in_edge_t *)&local_e0->addr_insn_p;
                    ppVVar1 = &local_e0->tied_regs;
                    if (peVar41 == (in_edge_t)local_e0->tied_regs) {
                      if (*(int *)&prVar38->used_locs != 0xb4) goto LAB_0015e665;
                      pbVar49 = local_e8;
                      bb = (char *)local_e0;
                      if (pbVar46 == (bb_insn_t_conflict)local_e0->temp_bitmap2) goto LAB_0015d7ca;
                      in_ZMM2 = ZEXT1664(auVar95);
                      pVStack_130 = (bitmap_t)0x15d877;
                      local_b0 = (DLIST_LINK_in_edge_t *)ppVVar1;
                      delete_bb_insn(local_f8,pbVar46);
                      pVStack_130 = (bitmap_t)0x15d88a;
                      local_d8 = prVar38;
                      bb = (char *)create_bb(pgVar76,(MIR_insn_t)prVar38);
                      pVStack_130 = (bitmap_t)0x15d8a3;
                      DLIST_bb_t_insert_before
                                (&pgVar76->curr_cfg->bbs,(bb_t_conflict)pgVar85,(bb_t_conflict)bb);
                      pgVar67 = local_f8;
                      uVar70 = pgVar76->curr_bb_index;
                      pgVar76->curr_bb_index = uVar70 + 1;
                      ((gen_ctx_t)bb)->ctx = (MIR_context_t)(ulong)uVar70;
                      peVar41 = (peVar90->in_link).prev;
                      if (peVar41 == (in_edge_t)0x0) {
                        if (*(edge_t_conflict *)&pgVar85->addr_insn_p == peVar90) {
                          peVar56 = (peVar90->in_link).next;
                          *(in_edge_t *)&pgVar85->addr_insn_p = peVar56;
                          goto LAB_0015d9cb;
                        }
LAB_0015e6e4:
                        pVStack_130 = (bitmap_t)0x15e6e9;
                        reg_alloc_cold_48();
LAB_0015e6e9:
                        pVStack_130 = (bitmap_t)0x15e6ee;
                        reg_alloc_cold_49();
LAB_0015e6ee:
                        pVStack_130 = (bitmap_t)0x15e6f3;
                        reg_alloc_cold_51();
LAB_0015e6f3:
                        pVStack_130 = (bitmap_t)0x15e712;
                        __assert_fail("!MIR_any_branch_code_p (tail_insn->code)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3c5,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      peVar56 = (peVar90->in_link).next;
                      (peVar41->in_link).next = peVar56;
LAB_0015d9cb:
                      if (peVar56 == (in_edge_t)0x0) {
                        pDVar54 = local_b0;
                        if (local_b0->prev != peVar90) goto LAB_0015e6e9;
                      }
                      else {
                        pDVar54 = &peVar56->in_link;
                      }
                      in_ZMM0 = ZEXT864(0) << 0x40;
                      pDVar54->prev = peVar41;
                      (peVar90->in_link).prev = (in_edge_t)0x0;
                      (peVar90->in_link).next = (in_edge_t)0x0;
                      peVar90->dst = (bb_t)bb;
                      peVar41 = (in_edge_t)((gen_ctx_t)bb)->tied_regs;
                      if (peVar41 == (in_edge_t)0x0) {
                        if (*(VARR_char **)&((gen_ctx_t)bb)->addr_insn_p != (VARR_char *)0x0)
                        goto LAB_0015e6ee;
                        ppeVar57 = (in_edge_t *)&((gen_ctx_t)bb)->addr_insn_p;
                      }
                      else {
                        if ((peVar41->in_link).next != (in_edge_t)0x0) {
                          pVStack_130 = (bitmap_t)0x15e6bd;
                          reg_alloc_cold_50();
LAB_0015e6bd:
                          pVStack_130 = (bitmap_t)0x15e6df;
                          __assert_fail("last_insn->code == MIR_JMP || last_insn->code == MIR_RET || last_insn->code == MIR_JRET"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                        ,0x392,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                        }
                        ppeVar57 = &(peVar41->in_link).next;
                      }
                      *ppeVar57 = peVar90;
                      (peVar90->in_link).next = (in_edge_t)0x0;
                      (peVar90->in_link).prev = peVar41;
                      ((gen_ctx_t)bb)->tied_regs = (bitmap_t)peVar90;
                      pVStack_130 = (bitmap_t)0x15da52;
                      create_edge(local_f8,(bb_t_conflict)bb,(bb_t_conflict)pgVar85,1,1);
                      pgVar76 = local_e0;
                      pbVar49 = local_e8;
                      pgVar86 = pgVar85;
                      if (((FILE *)pgVar67->debug_file == (FILE *)0x0) || (pgVar67->debug_level < 4)
                         ) goto LAB_0015d7ca;
                      pVStack_130 = (bitmap_t)0x15da82;
                      fprintf((FILE *)pgVar67->debug_file,
                              "     creating bb%lu before bb%lu, redirect the edge to it",
                              (gen_ctx *)((gen_ctx_t)bb)->ctx,local_e0->ctx);
                      pVStack_130 = (bitmap_t)0x15da9a;
                      fprintf((FILE *)pgVar67->debug_file,
                              ", and create fall-through edge bb%lu->bb%lu:\n",
                              (gen_ctx *)((gen_ctx_t)bb)->ctx,pgVar76->ctx);
                      pVStack_130 = (bitmap_t)0x15dab4;
                      fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar67->debug_file);
                      prVar38 = local_d8;
                      goto LAB_0015d7b8;
                    }
                    local_b0 = (DLIST_LINK_in_edge_t *)ppVVar1;
                    if (*(int *)&prVar38->used_locs != 0xb4) goto LAB_0015e61a;
                    for (; local_d8 = prVar38, local_c8 = pMVar69, local_b8 = pbVar81,
                        peVar41 != (in_edge_t)0x0; peVar41 = (peVar41->in_link).next) {
                      if (peVar41->fall_through_p != '\0') {
                        if ((gen_ctx_t)peVar41->dst != local_e0) goto LAB_0015e696;
                        pVStack_130 = (bitmap_t)0x15d901;
                        MIR_new_label_op(pMVar69,(MIR_label_t)prVar38);
                        pVStack_108 = pVStack_78;
                        pVStack_100 = pVStack_70;
                        local_128 = (MIR_context_t)local_98.bb;
                        pbStack_120 = (bb_t)local_98.live;
                        prStack_118 = (ra_ctx *)local_98.regs_to_save;
                        pVStack_110 = pVStack_80;
                        pVStack_130 = (bitmap_t)0x15d930;
                        insn = MIR_new_insn(pMVar69,MIR_JMP);
                        pgVar86 = local_f8;
                        pMVar84 = ((peVar41->src->bb_insns).tail)->insn;
                        local_a0 = insn;
                        if (((peVar41->out_link).next == (out_edge_t)0x0) &&
                           ((peVar41->out_link).prev == (out_edge_t)0x0)) {
                          iVar61 = (int)*(undefined8 *)&pMVar84->field_0x18;
                          if (((0xffffffd0 < iVar61 - 0xa5U) || (iVar61 == 0xaa)) ||
                             (iVar61 == 0xa6)) goto LAB_0015e6f3;
                          pVStack_130 = (bitmap_t)0x15df09;
                          gen_add_insn_after(local_f8,pMVar84,insn);
                          peVar41->fall_through_p = '\0';
                          if (((FILE *)pgVar86->debug_file == (FILE *)0x0) ||
                             (local_f8->debug_level < 4)) break;
                          sVar89 = peVar41->src->index;
                          pVStack_130 = (bitmap_t)0x15df52;
                          fprintf((FILE *)pgVar86->debug_file,
                                  "     Make edge bb%lu->bb%lu a non-fall through, add new insn at the of bb%lu "
                                  ,sVar89,peVar41->dst->index,sVar89);
                          pgVar76 = local_f8;
                        }
                        else {
                          pVStack_130 = (bitmap_t)0x15d96b;
                          MIR_insert_insn_after(pMVar69,local_f8->curr_func_item,pMVar84,insn);
                          pVStack_130 = (bitmap_t)0x15d976;
                          pbVar39 = create_bb(pgVar86,insn);
                          pgVar76 = (gen_ctx_t)peVar41->src;
                          pVStack_130 = (bitmap_t)0x15d987;
                          pgVar67 = pgVar86;
                          insert_new_bb_after(pgVar86,(bb_t_conflict)pgVar76,pbVar39);
                          pgVar85 = local_f8;
                          pbVar49 = peVar41->dst;
                          pgVar42 = (gen_ctx *)(peVar41->in_link).prev;
                          if (pgVar42 == (gen_ctx *)0x0) {
                            if ((pbVar49->in_edges).head == peVar41) {
                              pFVar75 = (FILE *)(peVar41->in_link).next;
                              (pbVar49->in_edges).head = (in_edge_t_conflict)pFVar75;
                              goto LAB_0015dad5;
                            }
                            pVStack_130 = (bitmap_t)0x15e717;
                            reg_alloc_cold_39();
LAB_0015e717:
                            pVStack_130 = (bitmap_t)0x15e71c;
                            reg_alloc_cold_40();
LAB_0015e71c:
                            pVStack_130 = (bitmap_t)add_bb_insn_dead_vars;
                            reg_alloc_cold_42();
                            pgStack_158 = pgVar86;
                            pbStack_150 = pbVar39;
                            ppvStack_148 = ppvVar87;
                            peStack_140 = peVar41;
                            peStack_138 = peVar90;
                            pVStack_130 = (bitmap_t)uVar62;
                            if (pgVar67->optimize_level == 0) goto LAB_0015ebdf;
                            pgVar85 = (gen_ctx_t)malloc(0x18);
                            pgVar86 = (gen_ctx_t)0x20;
                            pgVar85->ctx = (MIR_context_t)0x0;
                            *(c2mir_ctx **)&pgVar85->optimize_level = (c2mir_ctx *)0x4;
                            pMVar31 = (MIR_item_t)malloc(0x20);
                            pgVar85->curr_func_item = pMVar31;
                            pbVar39 = (pgVar67->curr_cfg->bbs).head;
                            if (pbVar39 == (bb_t_conflict)0x0) goto LAB_0015eb8c;
                            pgStack_178 = (gen_ctx_t)&pgVar67->free_dead_vars;
                            ppbStack_180 = (bb_t *)&(pgVar67->free_dead_vars).tail;
                            goto LAB_0015e79e;
                          }
                          pFVar75 = (FILE *)(peVar41->in_link).next;
                          pgVar42->debug_file = pFVar75;
LAB_0015dad5:
                          if (pFVar75 == (FILE *)0x0) {
                            pgVar76 = (gen_ctx_t)0x0;
                            if ((pbVar49->in_edges).tail != peVar41) goto LAB_0015e717;
                            pgVar76 = (gen_ctx_t)&(pbVar49->in_edges).tail;
                          }
                          else {
                            pgVar76 = (gen_ctx_t)&pFVar75->_IO_read_end;
                          }
                          pgVar76->ctx = (MIR_context_t)pgVar42;
                          (peVar41->in_link).prev = (in_edge_t)0x0;
                          (peVar41->in_link).next = (in_edge_t)0x0;
                          peVar41->dst = pbVar39;
                          peVar37 = (pbVar39->in_edges).tail;
                          if (peVar37 == (in_edge_t_conflict)0x0) {
                            if ((pbVar39->in_edges).head != (in_edge_t_conflict)0x0)
                            goto LAB_0015e71c;
                            pDVar55 = &pbVar39->in_edges;
                          }
                          else {
                            if ((peVar37->in_link).next != (in_edge_t)0x0) {
                              pVStack_130 = (bitmap_t)0x15e6e4;
                              reg_alloc_cold_41();
                              goto LAB_0015e6e4;
                            }
                            pDVar55 = (DLIST_in_edge_t *)&(peVar37->in_link).next;
                          }
                          pDVar55->head = peVar41;
                          (peVar41->in_link).next = (in_edge_t)0x0;
                          (peVar41->in_link).prev = peVar37;
                          (pbVar39->in_edges).tail = peVar41;
                          pVStack_130 = (bitmap_t)0x15db5e;
                          create_edge(local_f8,pbVar39,(bb_t_conflict)local_e0,0,1);
                          pgVar86 = local_e0;
                          if (((FILE *)pgVar85->debug_file == (FILE *)0x0) ||
                             (local_f8->debug_level < 4)) break;
                          local_128 = (MIR_context_t)pbVar39->index;
                          sVar89 = peVar41->src->index;
                          pVStack_130 = (bitmap_t)0x15dba5;
                          fprintf((FILE *)pgVar85->debug_file,
                                  "     creating bb%lu after bb%lu, redirect edge bb%lu->bb%lu to bb%lu"
                                  ,local_128,sVar89,sVar89);
                          pgVar76 = local_f8;
                          pVStack_130 = (bitmap_t)0x15dbc3;
                          fprintf((FILE *)local_f8->debug_file,
                                  ", and create jump edge bb%lu->bb%lu:\n",pbVar39->index,
                                  pgVar86->ctx);
                          pVStack_130 = (bitmap_t)0x15dbdd;
                          fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar76->debug_file);
                        }
                        pVStack_130 = (bitmap_t)0x15dbf2;
                        print_bb_insn(pgVar76,(bb_insn_t_conflict)local_a0->data,0);
                        break;
                      }
                      pbVar32 = (peVar41->src->bb_insns).tail;
                      if ((pbVar32 == (bb_insn_t)0x0) ||
                         (((iVar61 = (int)*(undefined8 *)&pbVar32->insn->field_0x18,
                           iVar61 - 0xa5U < 0xffffffd1 && (iVar61 != 0xa6)) && (iVar61 != 0xaa))))
                      goto LAB_0015e5df;
                    }
                    pMVar69 = local_c8;
                    pgVar85 = local_e0;
                    in_ZMM2 = ZEXT1664(auVar95);
                    pVStack_130 = (bitmap_t)0x15dc0d;
                    pgVar86 = (gen_ctx_t)MIR_new_label(local_c8);
                    pgVar76 = local_f8;
                    pVStack_130 = (bitmap_t)0x15dc29;
                    MIR_insert_insn_before
                              (pMVar69,local_f8->curr_func_item,(MIR_insn_t_conflict)local_d8,
                               (MIR_insn_t_conflict)pgVar86);
                    pVStack_130 = (bitmap_t)0x15dc34;
                    bb = (char *)create_bb(pgVar76,(MIR_insn_t)pgVar86);
                    pVStack_130 = (bitmap_t)0x15dc4d;
                    DLIST_bb_t_insert_before
                              (&pgVar76->curr_cfg->bbs,(bb_t_conflict)pgVar85,(bb_t_conflict)bb);
                    pgVar85 = local_f8;
                    uVar70 = pgVar76->curr_bb_index;
                    pgVar76->curr_bb_index = uVar70 + 1;
                    ((gen_ctx_t)bb)->ctx = (MIR_context_t)(ulong)uVar70;
                    if (peVar90 == (edge_t_conflict)0x0) {
                      pVStack_130 = (bitmap_t)0x15e641;
                      reg_alloc_cold_47();
                      goto LAB_0015e641;
                    }
                    peVar41 = (peVar90->in_link).prev;
                    if (peVar41 == (in_edge_t)0x0) {
                      if (*(edge_t_conflict *)&local_e0->addr_insn_p == peVar90) {
                        peVar56 = (peVar90->in_link).next;
                        *(in_edge_t *)&local_e0->addr_insn_p = peVar56;
                        goto LAB_0015dc9c;
                      }
                      pVStack_130 = (bitmap_t)0x15e68c;
                      reg_alloc_cold_43();
LAB_0015e68c:
                      pVStack_130 = (bitmap_t)0x15e691;
                      reg_alloc_cold_44();
LAB_0015e691:
                      pVStack_130 = (bitmap_t)0x15e696;
                      reg_alloc_cold_46();
LAB_0015e696:
                      pVStack_130 = (bitmap_t)0x15e6b8;
                      __assert_fail("e2->dst == dst",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x3c0,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                    }
                    peVar56 = (peVar90->in_link).next;
                    (peVar41->in_link).next = peVar56;
LAB_0015dc9c:
                    if (peVar56 == (in_edge_t)0x0) {
                      pDVar54 = local_b0;
                      if (local_b0->prev != peVar90) goto LAB_0015e68c;
                    }
                    else {
                      pDVar54 = &peVar56->in_link;
                    }
                    pDVar54->prev = peVar41;
                    (peVar90->in_link).prev = (in_edge_t)0x0;
                    (peVar90->in_link).next = (in_edge_t)0x0;
                    peVar90->dst = (bb_t)bb;
                    peVar41 = (in_edge_t)((gen_ctx_t)bb)->tied_regs;
                    if (peVar41 == (in_edge_t)0x0) {
                      if (*(VARR_char **)&((gen_ctx_t)bb)->addr_insn_p != (VARR_char *)0x0)
                      goto LAB_0015e691;
                      ppeVar57 = (in_edge_t *)&((gen_ctx_t)bb)->addr_insn_p;
                    }
                    else {
                      if ((peVar41->in_link).next != (in_edge_t)0x0) {
                        pVStack_130 = (bitmap_t)0x15e665;
                        reg_alloc_cold_45();
LAB_0015e665:
                        pVStack_130 = (bitmap_t)0x15e687;
                        __assert_fail("first_insn->code == MIR_LABEL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3a6,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      ppeVar57 = &(peVar41->in_link).next;
                    }
                    *ppeVar57 = peVar90;
                    (peVar90->in_link).next = (in_edge_t)0x0;
                    (peVar90->in_link).prev = peVar41;
                    ((gen_ctx_t)bb)->tied_regs = (bitmap_t)peVar90;
                    pVStack_130 = (bitmap_t)0x15dd20;
                    create_edge(local_f8,(bb_t_conflict)bb,(bb_t_conflict)local_e0,1,1);
                    pgVar76 = local_e0;
                    if (((FILE *)pgVar85->debug_file != (FILE *)0x0) && (3 < pgVar85->debug_level))
                    {
                      pVStack_130 = (bitmap_t)0x15dd50;
                      fprintf((FILE *)pgVar85->debug_file,
                              "     creating bb%lu before bb%lu, redirect the edge to it",
                              (gen_ctx *)((gen_ctx_t)bb)->ctx,local_e0->ctx);
                      pVStack_130 = (bitmap_t)0x15dd68;
                      fprintf((FILE *)pgVar85->debug_file,
                              ", and create fall-through edge bb%lu->bb%lu:\n",
                              (gen_ctx *)((gen_ctx_t)bb)->ctx,pgVar76->ctx);
                      pVStack_130 = (bitmap_t)0x15dd82;
                      fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar85->debug_file);
                      pVStack_130 = (bitmap_t)0x15dd90;
                      print_bb_insn(pgVar85,(bb_insn_t_conflict)pgVar86->ctx,0);
                      pVStack_130 = (bitmap_t)0x15ddaa;
                      fwrite("       change src bb insn ",0x1a,1,(FILE *)pgVar85->debug_file);
                      pVStack_130 = (bitmap_t)0x15ddb9;
                      print_bb_insn(pgVar85,local_b8,0);
                    }
                    prVar38 = local_d0;
                    pVVar15 = local_d0->used_locs;
                    if ((int)pVVar15 == 0xaa) {
                      if ((ulong)pVVar15 >> 0x21 == 0) goto LAB_0015e5b6;
                      lVar88 = 0;
                      while (*(ra_ctx **)((long)local_d0->lr_gap_bitmaps + lVar88 + 0x20) !=
                             local_d8) {
                        lVar88 = lVar88 + 0x30;
                        if (((ulong)pVVar15 >> 0x20) * 0x30 + -0x30 == lVar88) goto LAB_0015e5b6;
                      }
                      pVStack_130 = (bitmap_t)0x15de6c;
                      MIR_new_label_op(local_c8,(MIR_label_t)pgVar86);
                      auVar4._16_8_ = sStack_58;
                      auVar4._0_16_ = local_68;
                      auVar4._24_8_ = pVStack_50;
                      psVar3 = (size_t *)((long)prVar38->lr_gap_bitmaps + lVar88 + 0x20);
                      *psVar3 = sStack_58;
                      psVar3[1] = (size_t)pVStack_50;
                      psVar3[2] = (size_t)pVStack_48;
                      psVar3[3] = (size_t)pVStack_40;
                      *(undefined1 (*) [32])((long)prVar38->lr_gap_bitmaps + lVar88 + 0x10) = auVar4
                      ;
                    }
                    else {
                      if ((*(char *)&local_d0->var_bbs != '\f') ||
                         ((ra_ctx *)
                          (((anon_union_32_12_57d33f68_for_u *)&local_d0->spill_gaps)->str).len !=
                          local_d8)) {
LAB_0015e641:
                        pVStack_130 = (bitmap_t)0x15e660;
                        __assert_fail("last_insn->ops[0].mode == MIR_OP_LABEL && last_insn->ops[0].u.label == first_insn"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3fa,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      pMVar59 = (MIR_op_t *)&local_d0->busy_used_locs;
                      pVStack_130 = (bitmap_t)0x15de3c;
                      MIR_new_label_op(local_c8,(MIR_label_t)pgVar86);
                      auVar4._16_8_ = sStack_58;
                      auVar4._0_16_ = local_68;
                      auVar4._24_8_ = pVStack_50;
                      (((anon_union_32_12_57d33f68_for_u *)&prVar38->spill_gaps)->str).len =
                           sStack_58;
                      prVar38->curr_gaps = pVStack_50;
                      prVar38->lr_gap_bitmaps[0] = pVStack_48;
                      prVar38->lr_gap_bitmaps[1] = pVStack_40;
                      *(undefined1 (*) [32])pMVar59 = auVar4;
                    }
                    pgVar67 = local_f8;
                    in_ZMM0 = ZEXT3264(auVar4);
                    pbVar49 = local_e8;
                    if (((FILE *)local_f8->debug_file == (FILE *)0x0) ||
                       (*(int *)&((DLIST_LINK_bb_t *)&local_f8->debug_level)->prev < 4))
                    goto LAB_0015d7ca;
                    in_ZMM0 = ZEXT1664(auVar4._0_16_);
                    in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                    pVStack_130 = (bitmap_t)0x15dec1;
                    fwrite("         to insn ",0x11,1,(FILE *)local_f8->debug_file);
                    pbVar46 = local_b8;
                  }
                  else {
LAB_0015d64a:
                    in_ZMM2 = ZEXT1664(auVar95);
                    pVStack_130 = (bitmap_t)0x15d661;
                    prVar38 = (ra_ctx *)MIR_new_insn_arr(pMVar69,MIR_USE,0,(MIR_op_t *)0x0);
                    pgVar76 = local_f8;
                    pVStack_130 = (bitmap_t)0x15d67d;
                    MIR_insert_insn_after
                              (pMVar69,local_f8->curr_func_item,(MIR_insn_t_conflict)local_d0,
                               (MIR_insn_t_conflict)prVar38);
                    local_d0 = prVar38;
LAB_0015d680:
                    pVStack_130 = (bitmap_t)0x15d68d;
                    bb = (char *)create_bb(pgVar76,(MIR_insn_t)local_d0);
                    pVStack_130 = (bitmap_t)0x15d69e;
                    insert_new_bb_after(pgVar76,(bb_t_conflict)pgVar86,(bb_t_conflict)bb);
                    pgVar67 = local_f8;
                    peVar41 = (peVar90->in_link).prev;
                    if (peVar41 == (in_edge_t)0x0) {
                      if (*(edge_t_conflict *)&local_e0->addr_insn_p != peVar90) goto LAB_0015e60b;
                      peVar56 = (peVar90->in_link).next;
                      *(in_edge_t *)&local_e0->addr_insn_p = peVar56;
                    }
                    else {
                      peVar56 = (peVar90->in_link).next;
                      (peVar41->in_link).next = peVar56;
                    }
                    if (peVar56 == (in_edge_t)0x0) {
                      if ((edge_t_conflict)local_e0->tied_regs != peVar90) goto LAB_0015e610;
                      pDVar54 = (DLIST_LINK_in_edge_t *)&local_e0->tied_regs;
                    }
                    else {
                      pDVar54 = &peVar56->in_link;
                    }
                    in_ZMM0 = ZEXT864(0) << 0x40;
                    pDVar54->prev = peVar41;
                    (peVar90->in_link).prev = (in_edge_t)0x0;
                    (peVar90->in_link).next = (in_edge_t)0x0;
                    peVar90->dst = (bb_t)bb;
                    peVar41 = (in_edge_t)((gen_ctx_t)bb)->tied_regs;
                    if (peVar41 == (in_edge_t)0x0) {
                      if (*(VARR_char **)&((gen_ctx_t)bb)->addr_insn_p != (VARR_char *)0x0)
                      goto LAB_0015e615;
                      ppeVar57 = (in_edge_t *)&((gen_ctx_t)bb)->addr_insn_p;
                    }
                    else {
                      if ((peVar41->in_link).next != (in_edge_t)0x0) goto LAB_0015e606;
                      ppeVar57 = &(peVar41->in_link).next;
                    }
                    *ppeVar57 = peVar90;
                    (peVar90->in_link).next = (in_edge_t)0x0;
                    (peVar90->in_link).prev = peVar41;
                    ((gen_ctx_t)bb)->tied_regs = (bitmap_t)peVar90;
                    pVStack_130 = (bitmap_t)0x15d753;
                    create_edge(local_f8,(bb_t_conflict)bb,(bb_t_conflict)local_e0,
                                (uint)peVar90->fall_through_p,1);
                    peVar90->fall_through_p = '\x01';
                    pbVar49 = local_e8;
                    if (((FILE *)pgVar67->debug_file == (FILE *)0x0) || (pgVar67->debug_level < 4))
                    goto LAB_0015d7ca;
                    pVStack_130 = (bitmap_t)0x15d77c;
                    fprintf((FILE *)pgVar67->debug_file,
                            "     creating fall through bb%lu after bb%lu, redirect the edge to it",
                            (gen_ctx *)((gen_ctx_t)bb)->ctx,pgVar86->ctx);
                    pVStack_130 = (bitmap_t)0x15d799;
                    fprintf((FILE *)pgVar67->debug_file,", and create edge bb%lu->bb%lu:\n",
                            (gen_ctx *)((gen_ctx_t)bb)->ctx,local_e0->ctx);
                    pVStack_130 = (bitmap_t)0x15d7b3;
                    fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar67->debug_file);
                    prVar38 = local_d0;
LAB_0015d7b8:
                    pbVar46 = *(bb_insn_t_conflict *)&prVar38->start_mem_loc;
                  }
                  pVStack_130 = (bitmap_t)0x15d7c5;
                  print_bb_insn(pgVar67,pbVar46,0);
                  pbVar49 = local_e8;
                }
LAB_0015d7ca:
                ((anon_union_8_2_0ec0d2a8_for_u *)(ppvVar87 + 1))->bb = (bb_t_conflict)bb;
              }
              else {
                peVar36 = ((DLIST_out_edge_t *)&pgVar76->addr_regs)->head;
                if (peVar36 == (out_edge_t)0x0) goto LAB_0015e561;
                lVar88 = 1;
                do {
                  peVar36 = (peVar36->out_link).next;
                  lVar88 = lVar88 + -1;
                } while (peVar36 != (out_edge_t)0x0);
                if ((lVar88 != 0) ||
                   (peVar37 = ((DLIST_in_edge_t *)&pgVar76->addr_insn_p)->head,
                   peVar37 == (in_edge_t_conflict)0x0)) goto LAB_0015e561;
                lVar88 = 1;
                do {
                  peVar37 = (peVar37->in_link).next;
                  lVar88 = lVar88 + -1;
                } while (peVar37 != (in_edge_t)0x0);
                if (lVar88 != 0) goto LAB_0015e561;
                ((anon_union_8_2_0ec0d2a8_for_u *)(ppvVar87 + 1))->bb = (bb_t_conflict)pgVar76;
              }
            }
            else {
              peVar36 = ((DLIST_out_edge_t *)&pgVar86->addr_regs)->head;
              if (peVar36 == (out_edge_t)0x0) goto LAB_0015e4e4;
              lVar88 = 1;
              do {
                peVar36 = (peVar36->out_link).next;
                lVar88 = lVar88 + -1;
              } while (peVar36 != (out_edge_t)0x0);
              if ((lVar88 != 0) ||
                 (peVar37 = ((DLIST_in_edge_t *)&pgVar86->addr_insn_p)->head,
                 peVar37 == (in_edge_t_conflict)0x0)) goto LAB_0015e4e4;
              lVar88 = 1;
              do {
                peVar37 = (peVar37->in_link).next;
                lVar88 = lVar88 + -1;
              } while (peVar37 != (in_edge_t)0x0);
              if (lVar88 != 0) goto LAB_0015e4e4;
              ((anon_union_8_2_0ec0d2a8_for_u *)(ppvVar87 + 1))->bb = (bb_t_conflict)pgVar86;
            }
          }
          else {
            *(bb_t *)(ppvVar87 + 1) = peVar90->dst;
          }
        }
        else {
          *(bb_t *)(ppvVar87 + 1) = peVar90->src;
          *(char *)((long)ppvVar87 + 6) = '\x01';
        }
        auVar94 = in_ZMM2._0_16_;
        auVar95 = in_ZMM0._0_16_;
        pVVar40 = local_f8->ra_ctx->spill_els;
        if (pVVar40 == (VARR_spill_el_t *)0x0) {
          pVStack_130 = (bitmap_t)0x15e4a2;
          reg_alloc_cold_56();
LAB_0015e4a2:
          pVStack_130 = (bitmap_t)0x15e4a7;
          reg_alloc_cold_37();
LAB_0015e4a7:
          pVStack_130 = (bitmap_t)0x15e4ac;
          reg_alloc_cold_38();
LAB_0015e4ac:
          pVStack_130 = (bitmap_t)0x15e4b1;
          reg_alloc_cold_15();
          goto LAB_0015e4b1;
        }
        uVar62 = uVar62 + 1;
      } while (uVar62 < pVVar40->els_num);
    }
    sVar89 = pVVar40->els_num;
  }
  pgVar76 = local_f8;
  in_ZMM0 = ZEXT1664(auVar95);
  in_ZMM2 = ZEXT1664(auVar94);
  pVStack_130 = (bitmap_t)0x15dfd4;
  qsort(local_a8,sVar89,0x10,spill_el_sort_cmp);
  pVVar40 = pgVar76->ra_ctx->spill_els;
  if (pVVar40 != (VARR_spill_el_t *)0x0) {
    pgVar85 = (gen_ctx_t)pVVar40->els_num;
    psVar30 = pVVar40->varr;
    if (pgVar85 != (gen_ctx_t)0x0) {
      if (pgVar85 != (gen_ctx_t)&DAT_00000001) {
        puVar68 = (undefined1 *)((long)&pgVar85[-1].spot_attrs + 7);
        bb = (char *)(psVar30 + 1);
        lVar88 = 0;
        do {
          pVStack_130 = (bitmap_t)0x15e019;
          iVar61 = spill_el_cmp(psVar30 + lVar88,(spill_el_t *)bb);
          if (iVar61 != 0) {
            in_ZMM0 = ZEXT1664((undefined1  [16])*(spill_el_t *)bb);
            lVar88 = lVar88 + 1;
            psVar30[lVar88] = *(spill_el_t *)bb;
          }
          bb = (char *)((long)bb + 0x10);
          puVar68 = puVar68 + -1;
        } while (puVar68 != (undefined1 *)0x0);
        pVVar40 = pgVar76->ra_ctx->spill_els;
        if (pVVar40 == (VARR_spill_el_t *)0x0) goto LAB_0015e548;
        psVar30 = pVVar40->varr;
        pgVar85 = (gen_ctx_t)(lVar88 + 1);
        pgVar86 = pgVar85;
      }
      if ((psVar30 == (spill_el_t *)0x0) || ((gen_ctx_t)pVVar40->els_num < pgVar85))
      goto LAB_0015e548;
      pVVar40->els_num = (size_t)pgVar85;
    }
    gen_ctx = pgVar76;
    if (((FILE *)pgVar76->debug_file != (FILE *)0x0) && (1 < pgVar76->debug_level)) {
      pVStack_130 = (bitmap_t)0x15e09f;
      fwrite("+++++++++++++MIR after splitting edges:\n",0x28,1,(FILE *)pgVar76->debug_file);
      pVStack_130 = (bitmap_t)0x15e0b9;
      print_CFG(pgVar76,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      pVStack_130 = (bitmap_t)0x15e0d3;
      fwrite("  Spills on BBs:\n",0x11,1,(FILE *)pgVar76->debug_file);
      pVVar40 = pgVar76->ra_ctx->spill_els;
      if (pVVar40 != (VARR_spill_el_t *)0x0) {
        uVar62 = 0xffffffffffffffff;
        pgVar86 = (gen_ctx_t)0x1c199e;
        bb = "    %s r%d on %s of bb%lu\n";
        paVar35 = &psVar30->u;
        do {
          pgVar76 = local_f8;
          uVar62 = uVar62 + 1;
          if (pVVar40->els_num <= uVar62) goto LAB_0015e178;
          if (*(char *)((long)paVar35 + -3) != '\0') {
            pVStack_130 = (bitmap_t)0x15e44f;
            __assert_fail("!spill_els_addr[i].edge_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x2103,"void split(gen_ctx_t)");
          }
          pcVar58 = "spill";
          pcVar78 = "end";
          if (*(char *)((long)paVar35 + -4) == '\0') {
            pcVar58 = "restore";
          }
          if (*(char *)((long)paVar35 + -2) == '\0') {
            pcVar78 = "start";
          }
          pVStack_130 = (bitmap_t)0x15e15d;
          fprintf((FILE *)local_f8->debug_file,"    %s r%d on %s of bb%lu\n",pcVar58,
                  (ulong)((spill_el_t *)(paVar35 + -1))->reg,pcVar78,paVar35->e->src);
          pVVar40 = pgVar76->ra_ctx->spill_els;
          paVar35 = paVar35 + 2;
          gen_ctx = pgVar76;
        } while (pVVar40 != (VARR_spill_el_t *)0x0);
      }
      pVStack_130 = (bitmap_t)0x15e178;
      reg_alloc_cold_63();
      pVVar40 = extraout_RAX_00;
      gen_ctx = pgVar76;
    }
LAB_0015e178:
    pgVar76 = (gen_ctx_t)&psVar30->u;
    pMVar69 = (MIR_context_t)0xffffffffffffffff;
    do {
      pMVar69 = (MIR_context_t)((long)&pMVar69->gen_ctx + 1);
      if ((MIR_context_t)pVVar40->els_num <= pMVar69) goto LAB_0015c85c;
      psVar30 = (spill_el_t *)((long)pgVar76 + -8);
      if (psVar30->reg < 0x22) goto LAB_0015e35e;
      pcVar58 = (char *)((long)pgVar76 + -4);
      if (*(char *)((long)pgVar76 + -2) == '\0') {
        __stream = (FILE *)(((*(bb_t_conflict *)pgVar76)->bb_insns).head)->insn;
        bVar92 = *(int *)&__stream->_IO_read_base == 0xb4;
      }
      else {
        __stream = (FILE *)(((*(bb_t_conflict *)pgVar76)->bb_insns).tail)->insn;
        bVar92 = (*(int *)&__stream->_IO_read_base - 0xa6U & 0xfffffffb) != 0 &&
                 *(int *)&__stream->_IO_read_base - 0xa5U < 0xffffffd1;
      }
      pgVar76 = (gen_ctx_t)((long)pgVar76 + 0x10);
      pVStack_130 = (bitmap_t)0x15e204;
      spill_restore_reg(gen_ctx,psVar30->reg,local_bc,(MIR_insn_t)__stream,(uint)bVar92,
                        (uint)(*pcVar58 == '\0'));
      pVVar40 = gen_ctx->ra_ctx->spill_els;
    } while (pVVar40 != (VARR_spill_el_t *)0x0);
    pVStack_130 = (bitmap_t)0x15e220;
    reg_alloc_cold_64();
LAB_0015e226:
    pVStack_130 = (bitmap_t)0x15e23d;
    fprintf(__stream,"Compressing live ranges: from %ld to %ld - %ld%%\n",pgVar86,pgVar76);
    __stream = (FILE *)gen_ctx->debug_file;
LAB_0015e241:
    gen_ctx->lr_ctx->curr_point = (int)bb;
    if ((__stream != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      pVStack_130 = (bitmap_t)0x15e276;
      fwrite("Ranges after the compression:\n",0x1e,1,__stream);
      pVStack_130 = (bitmap_t)0x15e27e;
      print_all_live_ranges(gen_ctx);
    }
    goto LAB_0015c35b;
  }
LAB_0015e588:
  pVStack_130 = (bitmap_t)0x15e58d;
  reg_alloc_cold_66();
LAB_0015e58d:
  pVStack_130 = (bitmap_t)0x15e5ac;
  __assert_fail("born_p || dead_p",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x18e9,"void shrink_live_ranges(gen_ctx_t)");
}

Assistant:

static void reg_alloc (gen_ctx_t gen_ctx) {
  MIR_reg_t reg, max_var = get_max_var (gen_ctx);
  const int simplified_p = ONLY_SIMPLIFIED_RA || optimize_level < 2;

  build_live_ranges (gen_ctx);
  assign (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++Disposition after assignment:");
    for (reg = MAX_HARD_REG + 1; reg <= max_var; reg++) {
      if ((reg - MAX_HARD_REG + 1) % 8 == 0) fprintf (debug_file, "\n");
      fprintf (debug_file, " %3u=>", reg);
      if (VARR_LENGTH (live_range_t, var_live_ranges) <= reg
          || VARR_GET (live_range_t, var_live_ranges, reg) == NULL)
        fprintf (debug_file, "UA");
      else
        fprintf (debug_file, "%-2u", VARR_GET (MIR_reg_t, reg_renumber, reg));
    }
    fprintf (debug_file, "\n");
  });
  rewrite (gen_ctx); /* After rewrite the BB live info is invalid as it is used for spill info */
  if (!simplified_p) {
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++Spill info:\n");
      print_CFG (gen_ctx, TRUE, FALSE, FALSE, FALSE, output_bb_spill_info);
    });
    split (gen_ctx);
  }
  free_func_live_ranges (gen_ctx);
}